

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersectorK<4,16>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  void *pvVar8;
  __int_type_conflict _Var9;
  bool bVar10;
  bool bVar11;
  byte bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined8 uVar21;
  undefined8 uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [60];
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  byte bVar46;
  uint uVar47;
  ulong uVar48;
  long lVar50;
  uint uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  undefined8 in_R10;
  bool bVar55;
  bool bVar56;
  bool bVar57;
  bool bVar58;
  bool bVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar115 [64];
  undefined1 auVar117 [64];
  undefined1 auVar119 [64];
  undefined1 auVar121 [64];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  float fVar125;
  vint4 bi_2;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [64];
  undefined4 uVar132;
  vint4 bi_1;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar139;
  float fVar147;
  float fVar148;
  undefined1 auVar140 [16];
  float fVar149;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  vint4 ai_2;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar160;
  float fVar165;
  float fVar166;
  vint4 bi;
  float fVar167;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  vint4 ai;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  vint4 ai_1;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  vfloat4 a0_2;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  float fVar224;
  float fVar233;
  float fVar234;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  float fVar235;
  float fVar236;
  float fVar246;
  float fVar247;
  float fVar248;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar249;
  float fVar254;
  float fVar255;
  vfloat4 a0;
  undefined1 auVar250 [16];
  float fVar256;
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  vfloat4 a0_1;
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  undefined1 auVar268 [64];
  undefined1 auVar269 [64];
  undefined1 auVar270 [64];
  undefined1 auVar271 [64];
  undefined1 auVar272 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  vint<16> mask;
  BBox1f cv_stack [4];
  RTCFilterFunctionNArguments local_620;
  uint auStack_5f0 [4];
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [8];
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  undefined1 local_590 [8];
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  undefined1 local_570 [16];
  undefined1 local_560 [16];
  undefined1 local_550 [8];
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [16];
  undefined1 local_530 [8];
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [32];
  undefined8 uStack_420;
  undefined1 local_400 [64];
  undefined4 local_3c0;
  undefined4 uStack_3bc;
  undefined4 uStack_3b8;
  undefined4 uStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  ulong auStack_3a0 [4];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  ulong uVar49;
  undefined1 auVar114 [64];
  undefined1 auVar116 [64];
  undefined1 auVar118 [64];
  undefined1 auVar120 [64];
  undefined1 auVar122 [64];
  
  uVar48 = (ulong)(byte)prim[1];
  fVar125 = *(float *)(prim + uVar48 * 0x19 + 0x12);
  auVar60 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar60 = vinsertps_avx(auVar60,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar61 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar61 = vinsertps_avx(auVar61,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar60 = vsubps_avx(auVar60,*(undefined1 (*) [16])(prim + uVar48 * 0x19 + 6));
  auVar89._0_4_ = fVar125 * auVar60._0_4_;
  auVar89._4_4_ = fVar125 * auVar60._4_4_;
  auVar89._8_4_ = fVar125 * auVar60._8_4_;
  auVar89._12_4_ = fVar125 * auVar60._12_4_;
  auVar60 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 4 + 6)));
  auVar67._0_4_ = fVar125 * auVar61._0_4_;
  auVar67._4_4_ = fVar125 * auVar61._4_4_;
  auVar67._8_4_ = fVar125 * auVar61._8_4_;
  auVar67._12_4_ = fVar125 * auVar61._12_4_;
  auVar60 = vcvtdq2ps_avx(auVar60);
  auVar61 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 5 + 6)));
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar62 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 6 + 6)));
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0xb + 6)));
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0xc + 6)));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar72 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0xd + 6)));
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0x12 + 6)));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar71 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0x13 + 6)));
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0x14 + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar84._4_4_ = auVar67._0_4_;
  auVar84._0_4_ = auVar67._0_4_;
  auVar84._8_4_ = auVar67._0_4_;
  auVar84._12_4_ = auVar67._0_4_;
  auVar66 = vshufps_avx(auVar67,auVar67,0x55);
  auVar63 = vshufps_avx(auVar67,auVar67,0xaa);
  fVar125 = auVar63._0_4_;
  auVar82._0_4_ = fVar125 * auVar62._0_4_;
  fVar235 = auVar63._4_4_;
  auVar82._4_4_ = fVar235 * auVar62._4_4_;
  fVar224 = auVar63._8_4_;
  auVar82._8_4_ = fVar224 * auVar62._8_4_;
  fVar233 = auVar63._12_4_;
  auVar82._12_4_ = fVar233 * auVar62._12_4_;
  auVar70._0_4_ = auVar72._0_4_ * fVar125;
  auVar70._4_4_ = auVar72._4_4_ * fVar235;
  auVar70._8_4_ = auVar72._8_4_ * fVar224;
  auVar70._12_4_ = auVar72._12_4_ * fVar233;
  auVar68._0_4_ = fVar125 * auVar20._0_4_;
  auVar68._4_4_ = fVar235 * auVar20._4_4_;
  auVar68._8_4_ = fVar224 * auVar20._8_4_;
  auVar68._12_4_ = fVar233 * auVar20._12_4_;
  auVar63 = vfmadd231ps_fma(auVar82,auVar66,auVar61);
  auVar64 = vfmadd231ps_fma(auVar70,auVar66,auVar73);
  auVar66 = vfmadd231ps_fma(auVar68,auVar71,auVar66);
  auVar65 = vfmadd231ps_fma(auVar63,auVar84,auVar60);
  auVar64 = vfmadd231ps_fma(auVar64,auVar84,auVar74);
  auVar67 = vfmadd231ps_fma(auVar66,auVar75,auVar84);
  auVar86._4_4_ = auVar89._0_4_;
  auVar86._0_4_ = auVar89._0_4_;
  auVar86._8_4_ = auVar89._0_4_;
  auVar86._12_4_ = auVar89._0_4_;
  auVar66 = vshufps_avx(auVar89,auVar89,0x55);
  auVar63 = vshufps_avx(auVar89,auVar89,0xaa);
  fVar125 = auVar63._0_4_;
  auVar78._0_4_ = fVar125 * auVar62._0_4_;
  fVar235 = auVar63._4_4_;
  auVar78._4_4_ = fVar235 * auVar62._4_4_;
  fVar224 = auVar63._8_4_;
  auVar78._8_4_ = fVar224 * auVar62._8_4_;
  fVar233 = auVar63._12_4_;
  auVar78._12_4_ = fVar233 * auVar62._12_4_;
  auVar79._0_4_ = fVar125 * auVar72._0_4_;
  auVar79._4_4_ = fVar235 * auVar72._4_4_;
  auVar79._8_4_ = fVar224 * auVar72._8_4_;
  auVar79._12_4_ = fVar233 * auVar72._12_4_;
  auVar85._0_4_ = fVar125 * auVar20._0_4_;
  auVar85._4_4_ = fVar235 * auVar20._4_4_;
  auVar85._8_4_ = fVar224 * auVar20._8_4_;
  auVar85._12_4_ = fVar233 * auVar20._12_4_;
  auVar61 = vfmadd231ps_fma(auVar78,auVar66,auVar61);
  auVar62 = vfmadd231ps_fma(auVar79,auVar66,auVar73);
  auVar73 = vfmadd231ps_fma(auVar85,auVar66,auVar71);
  auVar72 = vfmadd231ps_fma(auVar61,auVar86,auVar60);
  auVar71 = vfmadd231ps_fma(auVar62,auVar86,auVar74);
  auVar20 = vfmadd231ps_fma(auVar73,auVar86,auVar75);
  auVar60 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar269 = ZEXT1664(auVar60);
  auVar61 = vandps_avx512vl(auVar65,auVar60);
  auVar88._8_4_ = 0x219392ef;
  auVar88._0_8_ = 0x219392ef219392ef;
  auVar88._12_4_ = 0x219392ef;
  uVar53 = vcmpps_avx512vl(auVar61,auVar88,1);
  bVar57 = (bool)((byte)uVar53 & 1);
  auVar63._0_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar65._0_4_;
  bVar57 = (bool)((byte)(uVar53 >> 1) & 1);
  auVar63._4_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar65._4_4_;
  bVar57 = (bool)((byte)(uVar53 >> 2) & 1);
  auVar63._8_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar65._8_4_;
  bVar57 = (bool)((byte)(uVar53 >> 3) & 1);
  auVar63._12_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar65._12_4_;
  auVar61 = vandps_avx512vl(auVar64,auVar60);
  uVar53 = vcmpps_avx512vl(auVar61,auVar88,1);
  bVar57 = (bool)((byte)uVar53 & 1);
  auVar65._0_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar64._0_4_;
  bVar57 = (bool)((byte)(uVar53 >> 1) & 1);
  auVar65._4_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar64._4_4_;
  bVar57 = (bool)((byte)(uVar53 >> 2) & 1);
  auVar65._8_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar64._8_4_;
  bVar57 = (bool)((byte)(uVar53 >> 3) & 1);
  auVar65._12_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar64._12_4_;
  auVar60 = vandps_avx512vl(auVar67,auVar60);
  uVar53 = vcmpps_avx512vl(auVar60,auVar88,1);
  bVar57 = (bool)((byte)uVar53 & 1);
  auVar64._0_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar67._0_4_;
  bVar57 = (bool)((byte)(uVar53 >> 1) & 1);
  auVar64._4_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar67._4_4_;
  bVar57 = (bool)((byte)(uVar53 >> 2) & 1);
  auVar64._8_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar67._8_4_;
  bVar57 = (bool)((byte)(uVar53 >> 3) & 1);
  auVar64._12_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar67._12_4_;
  auVar60 = vrcp14ps_avx512vl(auVar63);
  auVar61 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar270 = ZEXT1664(auVar61);
  auVar62 = vfnmadd213ps_avx512vl(auVar63,auVar60,auVar61);
  auVar74 = vfmadd132ps_fma(auVar62,auVar60,auVar60);
  auVar60 = vrcp14ps_avx512vl(auVar65);
  auVar62 = vfnmadd213ps_avx512vl(auVar65,auVar60,auVar61);
  auVar73 = vfmadd132ps_fma(auVar62,auVar60,auVar60);
  auVar62 = vrcp14ps_avx512vl(auVar64);
  auVar61 = vfnmadd213ps_avx512vl(auVar64,auVar62,auVar61);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = *(ulong *)(prim + uVar48 * 7 + 6);
  auVar60 = vpmovsxwd_avx(auVar60);
  auVar75 = vfmadd132ps_fma(auVar61,auVar62,auVar62);
  auVar60 = vcvtdq2ps_avx(auVar60);
  auVar62 = vsubps_avx(auVar60,auVar72);
  auVar61._8_8_ = 0;
  auVar61._0_8_ = *(ulong *)(prim + uVar48 * 9 + 6);
  auVar60 = vpmovsxwd_avx(auVar61);
  auVar83._0_4_ = auVar74._0_4_ * auVar62._0_4_;
  auVar83._4_4_ = auVar74._4_4_ * auVar62._4_4_;
  auVar83._8_4_ = auVar74._8_4_ * auVar62._8_4_;
  auVar83._12_4_ = auVar74._12_4_ * auVar62._12_4_;
  auVar60 = vcvtdq2ps_avx(auVar60);
  auVar61 = vsubps_avx(auVar60,auVar72);
  auVar62._8_8_ = 0;
  auVar62._0_8_ = *(ulong *)(prim + uVar48 * 0xe + 6);
  auVar60 = vpmovsxwd_avx(auVar62);
  auVar81._0_4_ = auVar74._0_4_ * auVar61._0_4_;
  auVar81._4_4_ = auVar74._4_4_ * auVar61._4_4_;
  auVar81._8_4_ = auVar74._8_4_ * auVar61._8_4_;
  auVar81._12_4_ = auVar74._12_4_ * auVar61._12_4_;
  auVar60 = vcvtdq2ps_avx(auVar60);
  auVar60 = vsubps_avx(auVar60,auVar71);
  auVar77._0_4_ = auVar73._0_4_ * auVar60._0_4_;
  auVar77._4_4_ = auVar73._4_4_ * auVar60._4_4_;
  auVar77._8_4_ = auVar73._8_4_ * auVar60._8_4_;
  auVar77._12_4_ = auVar73._12_4_ * auVar60._12_4_;
  auVar62 = vpbroadcastd_avx512vl();
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar60 = vpmovsxwd_avx(auVar74);
  auVar60 = vcvtdq2ps_avx(auVar60);
  auVar60 = vsubps_avx(auVar60,auVar71);
  auVar76._0_4_ = auVar73._0_4_ * auVar60._0_4_;
  auVar76._4_4_ = auVar73._4_4_ * auVar60._4_4_;
  auVar76._8_4_ = auVar73._8_4_ * auVar60._8_4_;
  auVar76._12_4_ = auVar73._12_4_ * auVar60._12_4_;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar48 * 0x15 + 6);
  auVar60 = vpmovsxwd_avx(auVar73);
  auVar60 = vcvtdq2ps_avx(auVar60);
  auVar60 = vsubps_avx(auVar60,auVar20);
  auVar80._0_4_ = auVar75._0_4_ * auVar60._0_4_;
  auVar80._4_4_ = auVar75._4_4_ * auVar60._4_4_;
  auVar80._8_4_ = auVar75._8_4_ * auVar60._8_4_;
  auVar80._12_4_ = auVar75._12_4_ * auVar60._12_4_;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar48 * 0x17 + 6);
  auVar60 = vpmovsxwd_avx(auVar72);
  auVar60 = vcvtdq2ps_avx(auVar60);
  auVar60 = vsubps_avx(auVar60,auVar20);
  auVar69._0_4_ = auVar75._0_4_ * auVar60._0_4_;
  auVar69._4_4_ = auVar75._4_4_ * auVar60._4_4_;
  auVar69._8_4_ = auVar75._8_4_ * auVar60._8_4_;
  auVar69._12_4_ = auVar75._12_4_ * auVar60._12_4_;
  auVar60 = vpminsd_avx(auVar83,auVar81);
  auVar61 = vpminsd_avx(auVar77,auVar76);
  auVar60 = vmaxps_avx(auVar60,auVar61);
  auVar61 = vpminsd_avx(auVar80,auVar69);
  uVar132 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar75._4_4_ = uVar132;
  auVar75._0_4_ = uVar132;
  auVar75._8_4_ = uVar132;
  auVar75._12_4_ = uVar132;
  auVar61 = vmaxps_avx512vl(auVar61,auVar75);
  auVar60 = vmaxps_avx(auVar60,auVar61);
  auVar71._8_4_ = 0x3f7ffffa;
  auVar71._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar71._12_4_ = 0x3f7ffffa;
  local_5e0 = vmulps_avx512vl(auVar60,auVar71);
  auVar60 = vpmaxsd_avx(auVar83,auVar81);
  auVar61 = vpmaxsd_avx(auVar77,auVar76);
  auVar60 = vminps_avx(auVar60,auVar61);
  auVar61 = vpmaxsd_avx(auVar80,auVar69);
  uVar132 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar20._4_4_ = uVar132;
  auVar20._0_4_ = uVar132;
  auVar20._8_4_ = uVar132;
  auVar20._12_4_ = uVar132;
  auVar61 = vminps_avx512vl(auVar61,auVar20);
  auVar60 = vminps_avx(auVar60,auVar61);
  auVar66._8_4_ = 0x3f800003;
  auVar66._0_8_ = 0x3f8000033f800003;
  auVar66._12_4_ = 0x3f800003;
  auVar60 = vmulps_avx512vl(auVar60,auVar66);
  uVar21 = vcmpps_avx512vl(local_5e0,auVar60,2);
  uVar22 = vpcmpgtd_avx512vl(auVar62,_DAT_01f4ad30);
  uVar53 = CONCAT44((int)((ulong)in_R10 >> 0x20),(uint)((byte)uVar21 & 0xf & (byte)uVar22));
  auVar131 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_380 = vmovdqa64_avx512f(auVar131);
  auVar60 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar272 = ZEXT1664(auVar60);
  auVar131 = ZEXT464(0x3f800000);
LAB_01818f64:
  if (uVar53 == 0) {
    return;
  }
  lVar50 = 0;
  for (uVar48 = uVar53; (uVar48 & 1) == 0; uVar48 = uVar48 >> 1 | 0x8000000000000000) {
    lVar50 = lVar50 + 1;
  }
  uVar3 = *(uint *)(prim + 2);
  uVar4 = *(uint *)(prim + lVar50 * 4 + 6);
  pGVar6 = (context->scene->geometries).items[uVar3].ptr;
  uVar48 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar4);
  p_Var7 = pGVar6[1].intersectionFilterN;
  pvVar8 = pGVar6[2].userPtr;
  _Var9 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar60 = *(undefined1 (*) [16])(_Var9 + uVar48 * (long)pvVar8);
  auVar61 = *(undefined1 (*) [16])(_Var9 + (uVar48 + 1) * (long)pvVar8);
  auVar62 = *(undefined1 (*) [16])(_Var9 + (uVar48 + 2) * (long)pvVar8);
  auVar74 = *(undefined1 (*) [16])(_Var9 + (long)pvVar8 * (uVar48 + 3));
  lVar50 = *(long *)&pGVar6[1].time_range.upper;
  auVar73 = *(undefined1 (*) [16])(lVar50 + (long)p_Var7 * uVar48);
  auVar72 = *(undefined1 (*) [16])(lVar50 + (long)p_Var7 * (uVar48 + 1));
  auVar75 = *(undefined1 (*) [16])(lVar50 + (long)p_Var7 * (uVar48 + 2));
  uVar53 = uVar53 - 1 & uVar53;
  auVar71 = *(undefined1 (*) [16])(lVar50 + (long)p_Var7 * (uVar48 + 3));
  if (uVar53 != 0) {
    uVar54 = uVar53 - 1 & uVar53;
    for (uVar48 = uVar53; (uVar48 & 1) == 0; uVar48 = uVar48 >> 1 | 0x8000000000000000) {
    }
    if (uVar54 != 0) {
      for (; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar20 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar20 = vinsertps_avx(auVar20,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  fVar125 = *(float *)(ray + k * 4 + 0xc0);
  auVar85 = auVar272._0_16_;
  auVar63 = vmulps_avx512vl(auVar71,auVar85);
  auVar133._0_12_ = ZEXT812(0);
  auVar133._12_4_ = 0;
  auVar66 = vfmadd213ps_fma(auVar133,auVar75,auVar63);
  auVar134._0_4_ = auVar72._0_4_ + auVar66._0_4_;
  auVar134._4_4_ = auVar72._4_4_ + auVar66._4_4_;
  auVar134._8_4_ = auVar72._8_4_ + auVar66._8_4_;
  auVar134._12_4_ = auVar72._12_4_ + auVar66._12_4_;
  auVar64 = vfmadd231ps_avx512vl(auVar134,auVar73,auVar85);
  auVar76 = ZEXT816(0) << 0x40;
  auVar140._0_4_ = auVar71._0_4_ * 0.0;
  auVar140._4_4_ = auVar71._4_4_ * 0.0;
  auVar140._8_4_ = auVar71._8_4_ * 0.0;
  auVar140._12_4_ = auVar71._12_4_ * 0.0;
  auVar65 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar66 = vfmadd231ps_avx512vl(auVar140,auVar75,auVar65);
  auVar66 = vfmadd231ps_fma(auVar66,auVar72,auVar76);
  auVar67 = vfnmadd231ps_avx512vl(auVar66,auVar73,auVar65);
  auVar68 = vmulps_avx512vl(auVar74,auVar85);
  auVar66 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar62,auVar68);
  auVar250._0_4_ = auVar66._0_4_ + auVar61._0_4_;
  auVar250._4_4_ = auVar66._4_4_ + auVar61._4_4_;
  auVar250._8_4_ = auVar66._8_4_ + auVar61._8_4_;
  auVar250._12_4_ = auVar66._12_4_ + auVar61._12_4_;
  auVar69 = vfmadd231ps_avx512vl(auVar250,auVar60,auVar85);
  auVar257._0_4_ = auVar74._0_4_ * 0.0;
  auVar257._4_4_ = auVar74._4_4_ * 0.0;
  auVar257._8_4_ = auVar74._8_4_ * 0.0;
  auVar257._12_4_ = auVar74._12_4_ * 0.0;
  auVar66 = vfmadd231ps_avx512vl(auVar257,auVar62,auVar65);
  auVar66 = vfmadd231ps_fma(auVar66,auVar61,auVar76);
  auVar70 = vfnmadd231ps_avx512vl(auVar66,auVar60,auVar65);
  auVar150._0_4_ = auVar75._0_4_ + auVar63._0_4_;
  auVar150._4_4_ = auVar75._4_4_ + auVar63._4_4_;
  auVar150._8_4_ = auVar75._8_4_ + auVar63._8_4_;
  auVar150._12_4_ = auVar75._12_4_ + auVar63._12_4_;
  auVar66 = vfmadd231ps_fma(auVar150,auVar72,auVar76);
  auVar66 = vfmadd231ps_avx512vl(auVar66,auVar73,auVar85);
  auVar71 = vmulps_avx512vl(auVar71,auVar65);
  auVar75 = vfmadd231ps_fma(auVar71,auVar76,auVar75);
  auVar72 = vfnmadd231ps_avx512vl(auVar75,auVar65,auVar72);
  auVar75 = vfmadd231ps_fma(auVar72,auVar76,auVar73);
  auVar208._0_4_ = auVar68._0_4_ + auVar62._0_4_;
  auVar208._4_4_ = auVar68._4_4_ + auVar62._4_4_;
  auVar208._8_4_ = auVar68._8_4_ + auVar62._8_4_;
  auVar208._12_4_ = auVar68._12_4_ + auVar62._12_4_;
  auVar73 = vfmadd231ps_fma(auVar208,auVar61,auVar76);
  auVar73 = vfmadd231ps_avx512vl(auVar73,auVar60,auVar85);
  auVar74 = vmulps_avx512vl(auVar74,auVar65);
  auVar62 = vfmadd231ps_fma(auVar74,auVar76,auVar62);
  auVar61 = vfnmadd231ps_avx512vl(auVar62,auVar65,auVar61);
  auVar72 = vfmadd231ps_fma(auVar61,auVar76,auVar60);
  auVar60 = vshufps_avx(auVar67,auVar67,0xc9);
  auVar61 = vshufps_avx(auVar69,auVar69,0xc9);
  fVar139 = auVar67._0_4_;
  auVar177._0_4_ = fVar139 * auVar61._0_4_;
  fVar147 = auVar67._4_4_;
  auVar177._4_4_ = fVar147 * auVar61._4_4_;
  fVar148 = auVar67._8_4_;
  auVar177._8_4_ = fVar148 * auVar61._8_4_;
  fVar149 = auVar67._12_4_;
  auVar177._12_4_ = fVar149 * auVar61._12_4_;
  auVar61 = vfmsub231ps_fma(auVar177,auVar60,auVar69);
  auVar62 = vshufps_avx(auVar61,auVar61,0xc9);
  auVar61 = vshufps_avx(auVar70,auVar70,0xc9);
  auVar178._0_4_ = fVar139 * auVar61._0_4_;
  auVar178._4_4_ = fVar147 * auVar61._4_4_;
  auVar178._8_4_ = fVar148 * auVar61._8_4_;
  auVar178._12_4_ = fVar149 * auVar61._12_4_;
  auVar60 = vfmsub231ps_fma(auVar178,auVar60,auVar70);
  auVar74 = vshufps_avx(auVar60,auVar60,0xc9);
  auVar60 = vshufps_avx(auVar75,auVar75,0xc9);
  auVar61 = vshufps_avx(auVar73,auVar73,0xc9);
  fVar160 = auVar75._0_4_;
  auVar168._0_4_ = fVar160 * auVar61._0_4_;
  fVar165 = auVar75._4_4_;
  auVar168._4_4_ = fVar165 * auVar61._4_4_;
  fVar166 = auVar75._8_4_;
  auVar168._8_4_ = fVar166 * auVar61._8_4_;
  fVar167 = auVar75._12_4_;
  auVar168._12_4_ = fVar167 * auVar61._12_4_;
  auVar61 = vfmsub231ps_fma(auVar168,auVar60,auVar73);
  auVar73 = vshufps_avx(auVar61,auVar61,0xc9);
  auVar61 = vshufps_avx(auVar72,auVar72,0xc9);
  auVar209._0_4_ = auVar61._0_4_ * fVar160;
  auVar209._4_4_ = auVar61._4_4_ * fVar165;
  auVar209._8_4_ = auVar61._8_4_ * fVar166;
  auVar209._12_4_ = auVar61._12_4_ * fVar167;
  auVar61 = vfmsub231ps_fma(auVar209,auVar60,auVar72);
  auVar60 = vdpps_avx(auVar62,auVar62,0x7f);
  auVar72 = vshufps_avx(auVar61,auVar61,0xc9);
  fVar224 = auVar60._0_4_;
  auVar210._4_12_ = ZEXT812(0) << 0x20;
  auVar210._0_4_ = fVar224;
  auVar61 = vrsqrt14ss_avx512f(auVar76,auVar210);
  auVar71 = vmulss_avx512f(auVar61,ZEXT416(0x3fc00000));
  auVar63 = vmulss_avx512f(auVar60,ZEXT416(0xbf000000));
  fVar235 = auVar61._0_4_;
  auVar61 = vdpps_avx(auVar62,auVar74,0x7f);
  fVar235 = auVar71._0_4_ + auVar63._0_4_ * fVar235 * fVar235 * fVar235;
  fVar236 = fVar235 * auVar62._0_4_;
  fVar246 = fVar235 * auVar62._4_4_;
  fVar247 = fVar235 * auVar62._8_4_;
  fVar248 = fVar235 * auVar62._12_4_;
  auVar219._0_4_ = auVar74._0_4_ * fVar224;
  auVar219._4_4_ = auVar74._4_4_ * fVar224;
  auVar219._8_4_ = auVar74._8_4_ * fVar224;
  auVar219._12_4_ = auVar74._12_4_ * fVar224;
  fVar224 = auVar61._0_4_;
  auVar190._0_4_ = fVar224 * auVar62._0_4_;
  auVar190._4_4_ = fVar224 * auVar62._4_4_;
  auVar190._8_4_ = fVar224 * auVar62._8_4_;
  auVar190._12_4_ = fVar224 * auVar62._12_4_;
  auVar62 = vsubps_avx(auVar219,auVar190);
  auVar61 = vrcp14ss_avx512f(auVar76,auVar210);
  auVar60 = vfnmadd213ss_avx512f(auVar60,auVar61,ZEXT416(0x40000000));
  fVar233 = auVar61._0_4_ * auVar60._0_4_;
  auVar60 = vdpps_avx(auVar73,auVar73,0x7f);
  fVar234 = auVar60._0_4_;
  auVar211._4_12_ = ZEXT812(0) << 0x20;
  auVar211._0_4_ = fVar234;
  auVar61 = vrsqrt14ss_avx512f(auVar76,auVar211);
  auVar74 = vmulss_avx512f(auVar61,ZEXT416(0x3fc00000));
  auVar71 = vmulss_avx512f(auVar60,ZEXT416(0xbf000000));
  fVar224 = auVar61._0_4_;
  fVar224 = auVar74._0_4_ + auVar71._0_4_ * fVar224 * fVar224 * fVar224;
  auVar61 = vdpps_avx(auVar73,auVar72,0x7f);
  fVar249 = fVar224 * auVar73._0_4_;
  fVar254 = fVar224 * auVar73._4_4_;
  fVar255 = fVar224 * auVar73._8_4_;
  fVar256 = fVar224 * auVar73._12_4_;
  auVar179._0_4_ = fVar234 * auVar72._0_4_;
  auVar179._4_4_ = fVar234 * auVar72._4_4_;
  auVar179._8_4_ = fVar234 * auVar72._8_4_;
  auVar179._12_4_ = fVar234 * auVar72._12_4_;
  fVar234 = auVar61._0_4_;
  auVar169._0_4_ = fVar234 * auVar73._0_4_;
  auVar169._4_4_ = fVar234 * auVar73._4_4_;
  auVar169._8_4_ = fVar234 * auVar73._8_4_;
  auVar169._12_4_ = fVar234 * auVar73._12_4_;
  auVar74 = vsubps_avx(auVar179,auVar169);
  auVar61 = vrcp14ss_avx512f(auVar76,auVar211);
  auVar60 = vfnmadd213ss_avx512f(auVar60,auVar61,ZEXT416(0x40000000));
  fVar234 = auVar60._0_4_ * auVar61._0_4_;
  auVar60 = vshufps_avx(auVar64,auVar64,0xff);
  auVar196._0_4_ = fVar236 * auVar60._0_4_;
  auVar196._4_4_ = fVar246 * auVar60._4_4_;
  auVar196._8_4_ = fVar247 * auVar60._8_4_;
  auVar196._12_4_ = fVar248 * auVar60._12_4_;
  local_520 = vsubps_avx(auVar64,auVar196);
  auVar61 = vshufps_avx(auVar67,auVar67,0xff);
  auVar180._0_4_ = auVar61._0_4_ * fVar236 + auVar60._0_4_ * fVar235 * fVar233 * auVar62._0_4_;
  auVar180._4_4_ = auVar61._4_4_ * fVar246 + auVar60._4_4_ * fVar235 * fVar233 * auVar62._4_4_;
  auVar180._8_4_ = auVar61._8_4_ * fVar247 + auVar60._8_4_ * fVar235 * fVar233 * auVar62._8_4_;
  auVar180._12_4_ = auVar61._12_4_ * fVar248 + auVar60._12_4_ * fVar235 * fVar233 * auVar62._12_4_;
  auVar62 = vsubps_avx(auVar67,auVar180);
  local_530._0_4_ = auVar196._0_4_ + auVar64._0_4_;
  local_530._4_4_ = auVar196._4_4_ + auVar64._4_4_;
  fStack_528 = auVar196._8_4_ + auVar64._8_4_;
  fStack_524 = auVar196._12_4_ + auVar64._12_4_;
  auVar60 = vshufps_avx(auVar66,auVar66,0xff);
  auVar181._0_4_ = fVar249 * auVar60._0_4_;
  auVar181._4_4_ = fVar254 * auVar60._4_4_;
  auVar181._8_4_ = fVar255 * auVar60._8_4_;
  auVar181._12_4_ = fVar256 * auVar60._12_4_;
  local_540 = vsubps_avx512vl(auVar66,auVar181);
  auVar61 = vshufps_avx(auVar75,auVar75,0xff);
  auVar141._0_4_ = auVar61._0_4_ * fVar249 + auVar60._0_4_ * fVar224 * auVar74._0_4_ * fVar234;
  auVar141._4_4_ = auVar61._4_4_ * fVar254 + auVar60._4_4_ * fVar224 * auVar74._4_4_ * fVar234;
  auVar141._8_4_ = auVar61._8_4_ * fVar255 + auVar60._8_4_ * fVar224 * auVar74._8_4_ * fVar234;
  auVar141._12_4_ = auVar61._12_4_ * fVar256 + auVar60._12_4_ * fVar224 * auVar74._12_4_ * fVar234;
  auVar60 = vsubps_avx(auVar75,auVar141);
  local_550._0_4_ = auVar66._0_4_ + auVar181._0_4_;
  local_550._4_4_ = auVar66._4_4_ + auVar181._4_4_;
  fStack_548 = auVar66._8_4_ + auVar181._8_4_;
  fStack_544 = auVar66._12_4_ + auVar181._12_4_;
  auVar151._0_4_ = auVar62._0_4_ * 0.33333334;
  auVar151._4_4_ = auVar62._4_4_ * 0.33333334;
  auVar151._8_4_ = auVar62._8_4_ * 0.33333334;
  auVar151._12_4_ = auVar62._12_4_ * 0.33333334;
  local_560 = vaddps_avx512vl(local_520,auVar151);
  auVar152._0_4_ = auVar60._0_4_ * 0.33333334;
  auVar152._4_4_ = auVar60._4_4_ * 0.33333334;
  auVar152._8_4_ = auVar60._8_4_ * 0.33333334;
  auVar152._12_4_ = auVar60._12_4_ * 0.33333334;
  local_570 = vsubps_avx512vl(local_540,auVar152);
  auVar135._0_4_ = (fVar139 + auVar180._0_4_) * 0.33333334;
  auVar135._4_4_ = (fVar147 + auVar180._4_4_) * 0.33333334;
  auVar135._8_4_ = (fVar148 + auVar180._8_4_) * 0.33333334;
  auVar135._12_4_ = (fVar149 + auVar180._12_4_) * 0.33333334;
  _local_580 = vaddps_avx512vl(_local_530,auVar135);
  auVar136._0_4_ = (fVar160 + auVar141._0_4_) * 0.33333334;
  auVar136._4_4_ = (fVar165 + auVar141._4_4_) * 0.33333334;
  auVar136._8_4_ = (fVar166 + auVar141._8_4_) * 0.33333334;
  auVar136._12_4_ = (fVar167 + auVar141._12_4_) * 0.33333334;
  _local_590 = vsubps_avx512vl(_local_550,auVar136);
  local_4a0 = vsubps_avx(local_520,auVar20);
  uVar132 = local_4a0._0_4_;
  auVar142._4_4_ = uVar132;
  auVar142._0_4_ = uVar132;
  auVar142._8_4_ = uVar132;
  auVar142._12_4_ = uVar132;
  auVar60 = vshufps_avx(local_4a0,local_4a0,0x55);
  aVar1 = pre->ray_space[k].vx.field_0;
  aVar2 = pre->ray_space[k].vy.field_0;
  auVar61 = vshufps_avx(local_4a0,local_4a0,0xaa);
  fVar235 = pre->ray_space[k].vz.field_0.m128[0];
  fVar224 = pre->ray_space[k].vz.field_0.m128[1];
  fVar233 = pre->ray_space[k].vz.field_0.m128[2];
  fVar234 = pre->ray_space[k].vz.field_0.m128[3];
  auVar137._0_4_ = fVar235 * auVar61._0_4_;
  auVar137._4_4_ = fVar224 * auVar61._4_4_;
  auVar137._8_4_ = fVar233 * auVar61._8_4_;
  auVar137._12_4_ = fVar234 * auVar61._12_4_;
  auVar60 = vfmadd231ps_fma(auVar137,(undefined1  [16])aVar2,auVar60);
  auVar75 = vfmadd231ps_fma(auVar60,(undefined1  [16])aVar1,auVar142);
  local_4b0 = vsubps_avx512vl(local_560,auVar20);
  uVar132 = local_4b0._0_4_;
  auVar153._4_4_ = uVar132;
  auVar153._0_4_ = uVar132;
  auVar153._8_4_ = uVar132;
  auVar153._12_4_ = uVar132;
  auVar60 = vshufps_avx(local_4b0,local_4b0,0x55);
  auVar61 = vshufps_avx(local_4b0,local_4b0,0xaa);
  auVar143._0_4_ = fVar235 * auVar61._0_4_;
  auVar143._4_4_ = fVar224 * auVar61._4_4_;
  auVar143._8_4_ = fVar233 * auVar61._8_4_;
  auVar143._12_4_ = fVar234 * auVar61._12_4_;
  auVar60 = vfmadd231ps_fma(auVar143,(undefined1  [16])aVar2,auVar60);
  auVar71 = vfmadd231ps_fma(auVar60,(undefined1  [16])aVar1,auVar153);
  local_4c0 = vsubps_avx512vl(local_570,auVar20);
  uVar132 = local_4c0._0_4_;
  auVar182._4_4_ = uVar132;
  auVar182._0_4_ = uVar132;
  auVar182._8_4_ = uVar132;
  auVar182._12_4_ = uVar132;
  auVar60 = vshufps_avx(local_4c0,local_4c0,0x55);
  auVar61 = vshufps_avx(local_4c0,local_4c0,0xaa);
  auVar154._0_4_ = fVar235 * auVar61._0_4_;
  auVar154._4_4_ = fVar224 * auVar61._4_4_;
  auVar154._8_4_ = fVar233 * auVar61._8_4_;
  auVar154._12_4_ = fVar234 * auVar61._12_4_;
  auVar60 = vfmadd231ps_fma(auVar154,(undefined1  [16])aVar2,auVar60);
  auVar66 = vfmadd231ps_fma(auVar60,(undefined1  [16])aVar1,auVar182);
  local_4d0 = vsubps_avx512vl(local_540,auVar20);
  uVar132 = local_4d0._0_4_;
  auVar197._4_4_ = uVar132;
  auVar197._0_4_ = uVar132;
  auVar197._8_4_ = uVar132;
  auVar197._12_4_ = uVar132;
  auVar60 = vshufps_avx(local_4d0,local_4d0,0x55);
  auVar61 = vshufps_avx(local_4d0,local_4d0,0xaa);
  auVar183._0_4_ = fVar235 * auVar61._0_4_;
  auVar183._4_4_ = fVar224 * auVar61._4_4_;
  auVar183._8_4_ = fVar233 * auVar61._8_4_;
  auVar183._12_4_ = fVar234 * auVar61._12_4_;
  auVar60 = vfmadd231ps_fma(auVar183,(undefined1  [16])aVar2,auVar60);
  auVar63 = vfmadd231ps_fma(auVar60,(undefined1  [16])aVar1,auVar197);
  local_4e0 = vsubps_avx(_local_530,auVar20);
  uVar132 = local_4e0._0_4_;
  auVar198._4_4_ = uVar132;
  auVar198._0_4_ = uVar132;
  auVar198._8_4_ = uVar132;
  auVar198._12_4_ = uVar132;
  auVar60 = vshufps_avx(local_4e0,local_4e0,0x55);
  auVar61 = vshufps_avx(local_4e0,local_4e0,0xaa);
  auVar220._0_4_ = auVar61._0_4_ * fVar235;
  auVar220._4_4_ = auVar61._4_4_ * fVar224;
  auVar220._8_4_ = auVar61._8_4_ * fVar233;
  auVar220._12_4_ = auVar61._12_4_ * fVar234;
  auVar60 = vfmadd231ps_fma(auVar220,(undefined1  [16])aVar2,auVar60);
  auVar64 = vfmadd231ps_fma(auVar60,(undefined1  [16])aVar1,auVar198);
  local_4f0 = vsubps_avx512vl(_local_580,auVar20);
  uVar132 = local_4f0._0_4_;
  auVar199._4_4_ = uVar132;
  auVar199._0_4_ = uVar132;
  auVar199._8_4_ = uVar132;
  auVar199._12_4_ = uVar132;
  auVar60 = vshufps_avx(local_4f0,local_4f0,0x55);
  auVar61 = vshufps_avx(local_4f0,local_4f0,0xaa);
  auVar225._0_4_ = auVar61._0_4_ * fVar235;
  auVar225._4_4_ = auVar61._4_4_ * fVar224;
  auVar225._8_4_ = auVar61._8_4_ * fVar233;
  auVar225._12_4_ = auVar61._12_4_ * fVar234;
  auVar60 = vfmadd231ps_fma(auVar225,(undefined1  [16])aVar2,auVar60);
  auVar65 = vfmadd231ps_fma(auVar60,(undefined1  [16])aVar1,auVar199);
  local_500 = vsubps_avx512vl(_local_590,auVar20);
  uVar132 = local_500._0_4_;
  auVar200._4_4_ = uVar132;
  auVar200._0_4_ = uVar132;
  auVar200._8_4_ = uVar132;
  auVar200._12_4_ = uVar132;
  auVar60 = vshufps_avx(local_500,local_500,0x55);
  auVar61 = vshufps_avx(local_500,local_500,0xaa);
  auVar237._0_4_ = auVar61._0_4_ * fVar235;
  auVar237._4_4_ = auVar61._4_4_ * fVar224;
  auVar237._8_4_ = auVar61._8_4_ * fVar233;
  auVar237._12_4_ = auVar61._12_4_ * fVar234;
  auVar60 = vfmadd231ps_fma(auVar237,(undefined1  [16])aVar2,auVar60);
  auVar67 = vfmadd231ps_fma(auVar60,(undefined1  [16])aVar1,auVar200);
  local_510 = vsubps_avx(_local_550,auVar20);
  uVar132 = local_510._0_4_;
  auVar126._4_4_ = uVar132;
  auVar126._0_4_ = uVar132;
  auVar126._8_4_ = uVar132;
  auVar126._12_4_ = uVar132;
  auVar60 = vshufps_avx(local_510,local_510,0x55);
  auVar61 = vshufps_avx(local_510,local_510,0xaa);
  auVar191._0_4_ = auVar61._0_4_ * fVar235;
  auVar191._4_4_ = auVar61._4_4_ * fVar224;
  auVar191._8_4_ = auVar61._8_4_ * fVar233;
  auVar191._12_4_ = auVar61._12_4_ * fVar234;
  auVar60 = vfmadd231ps_fma(auVar191,(undefined1  [16])aVar2,auVar60);
  auVar20 = vfmadd231ps_fma(auVar60,(undefined1  [16])aVar1,auVar126);
  auVar62 = vmovlhps_avx(auVar75,auVar64);
  auVar74 = vmovlhps_avx(auVar71,auVar65);
  auVar72 = vmovlhps_avx512f(auVar66,auVar67);
  _local_480 = vmovlhps_avx512f(auVar63,auVar20);
  auVar61 = vminps_avx(auVar62,auVar74);
  auVar60 = vmaxps_avx(auVar62,auVar74);
  auVar73 = vminps_avx512vl(auVar72,_local_480);
  auVar61 = vminps_avx(auVar61,auVar73);
  auVar73 = vmaxps_avx512vl(auVar72,_local_480);
  auVar60 = vmaxps_avx(auVar60,auVar73);
  auVar73 = vshufpd_avx(auVar61,auVar61,3);
  auVar61 = vminps_avx(auVar61,auVar73);
  auVar73 = vshufpd_avx(auVar60,auVar60,3);
  auVar60 = vmaxps_avx(auVar60,auVar73);
  auVar61 = vandps_avx512vl(auVar61,auVar269._0_16_);
  auVar60 = vandps_avx512vl(auVar60,auVar269._0_16_);
  auVar60 = vmaxps_avx(auVar61,auVar60);
  auVar61 = vmovshdup_avx(auVar60);
  auVar60 = vmaxss_avx(auVar61,auVar60);
  auVar61 = vmovddup_avx512vl(auVar75);
  auVar73 = vmovddup_avx512vl(auVar71);
  auVar75 = vmovddup_avx512vl(auVar66);
  auVar71 = vmovddup_avx512vl(auVar63);
  local_490 = ZEXT416((uint)(auVar60._0_4_ * 9.536743e-07));
  local_440 = vbroadcastss_avx512vl(local_490);
  auVar60 = vxorps_avx512vl(local_440._0_16_,auVar85);
  local_3c0 = auVar60._0_4_;
  uStack_3bc = local_3c0;
  uStack_3b8 = local_3c0;
  uStack_3b4 = local_3c0;
  uStack_3b0 = local_3c0;
  uStack_3ac = local_3c0;
  uStack_3a8 = local_3c0;
  uStack_3a4 = local_3c0;
  uVar48 = 0;
  local_450 = vsubps_avx(auVar74,auVar62);
  local_460 = vsubps_avx512vl(auVar72,auVar74);
  local_470 = vsubps_avx512vl(_local_480,auVar72);
  local_5a0 = vsubps_avx(_local_530,local_520);
  local_5b0 = vsubps_avx512vl(_local_580,local_560);
  local_5c0 = vsubps_avx512vl(_local_590,local_570);
  _local_5d0 = vsubps_avx512vl(_local_550,local_540);
  auVar111 = vpbroadcastd_avx512f();
  local_300 = vmovdqa64_avx512f(auVar111);
  auVar111 = vpbroadcastd_avx512f();
  local_340 = vmovdqa64_avx512f(auVar111);
  auVar60 = ZEXT816(0x3f80000000000000);
  auVar87 = auVar60;
LAB_018196d9:
  do {
    auVar271 = ZEXT3264(local_440);
    auVar66 = vshufps_avx(auVar87,auVar87,0x50);
    auVar258._8_4_ = 0x3f800000;
    auVar258._0_8_ = 0x3f8000003f800000;
    auVar258._12_4_ = 0x3f800000;
    auVar110._16_4_ = 0x3f800000;
    auVar110._0_16_ = auVar258;
    auVar110._20_4_ = 0x3f800000;
    auVar110._24_4_ = 0x3f800000;
    auVar110._28_4_ = 0x3f800000;
    auVar63 = vsubps_avx(auVar258,auVar66);
    fVar235 = auVar66._0_4_;
    fVar139 = auVar64._0_4_;
    auVar161._0_4_ = fVar139 * fVar235;
    fVar224 = auVar66._4_4_;
    fVar147 = auVar64._4_4_;
    auVar161._4_4_ = fVar147 * fVar224;
    fVar233 = auVar66._8_4_;
    auVar161._8_4_ = fVar139 * fVar233;
    fVar234 = auVar66._12_4_;
    auVar161._12_4_ = fVar147 * fVar234;
    fVar148 = auVar65._0_4_;
    auVar170._0_4_ = fVar148 * fVar235;
    fVar149 = auVar65._4_4_;
    auVar170._4_4_ = fVar149 * fVar224;
    auVar170._8_4_ = fVar148 * fVar233;
    auVar170._12_4_ = fVar149 * fVar234;
    fVar160 = auVar67._0_4_;
    auVar184._0_4_ = fVar160 * fVar235;
    fVar165 = auVar67._4_4_;
    auVar184._4_4_ = fVar165 * fVar224;
    auVar184._8_4_ = fVar160 * fVar233;
    auVar184._12_4_ = fVar165 * fVar234;
    fVar166 = auVar20._0_4_;
    auVar144._0_4_ = fVar166 * fVar235;
    fVar167 = auVar20._4_4_;
    auVar144._4_4_ = fVar167 * fVar224;
    auVar144._8_4_ = fVar166 * fVar233;
    auVar144._12_4_ = fVar167 * fVar234;
    auVar68 = vfmadd231ps_avx512vl(auVar161,auVar63,auVar61);
    auVar69 = vfmadd231ps_avx512vl(auVar170,auVar63,auVar73);
    auVar70 = vfmadd231ps_avx512vl(auVar184,auVar63,auVar75);
    auVar63 = vfmadd231ps_avx512vl(auVar144,auVar71,auVar63);
    auVar66 = vmovshdup_avx(auVar60);
    fVar224 = auVar60._0_4_;
    fVar235 = (auVar66._0_4_ - fVar224) * 0.04761905;
    auVar104._4_4_ = fVar224;
    auVar104._0_4_ = fVar224;
    auVar104._8_4_ = fVar224;
    auVar104._12_4_ = fVar224;
    auVar104._16_4_ = fVar224;
    auVar104._20_4_ = fVar224;
    auVar104._24_4_ = fVar224;
    auVar104._28_4_ = fVar224;
    auVar94._0_8_ = auVar66._0_8_;
    auVar94._8_8_ = auVar94._0_8_;
    auVar94._16_8_ = auVar94._0_8_;
    auVar94._24_8_ = auVar94._0_8_;
    auVar107 = vsubps_avx(auVar94,auVar104);
    uVar132 = auVar68._0_4_;
    auVar108._4_4_ = uVar132;
    auVar108._0_4_ = uVar132;
    auVar108._8_4_ = uVar132;
    auVar108._12_4_ = uVar132;
    auVar108._16_4_ = uVar132;
    auVar108._20_4_ = uVar132;
    auVar108._24_4_ = uVar132;
    auVar108._28_4_ = uVar132;
    auVar96._8_4_ = 1;
    auVar96._0_8_ = 0x100000001;
    auVar96._12_4_ = 1;
    auVar96._16_4_ = 1;
    auVar96._20_4_ = 1;
    auVar96._24_4_ = 1;
    auVar96._28_4_ = 1;
    auVar106 = ZEXT1632(auVar68);
    auVar105 = vpermps_avx2(auVar96,auVar106);
    auVar90 = vbroadcastss_avx512vl(auVar69);
    auVar100 = ZEXT1632(auVar69);
    auVar91 = vpermps_avx512vl(auVar96,auVar100);
    auVar92 = vbroadcastss_avx512vl(auVar70);
    auVar101 = ZEXT1632(auVar70);
    auVar93 = vpermps_avx512vl(auVar96,auVar101);
    auVar94 = vbroadcastss_avx512vl(auVar63);
    auVar103 = ZEXT1632(auVar63);
    auVar95 = vpermps_avx512vl(auVar96,auVar103);
    auVar109._4_4_ = fVar235;
    auVar109._0_4_ = fVar235;
    auVar109._8_4_ = fVar235;
    auVar109._12_4_ = fVar235;
    auVar109._16_4_ = fVar235;
    auVar109._20_4_ = fVar235;
    auVar109._24_4_ = fVar235;
    auVar109._28_4_ = fVar235;
    auVar102._8_4_ = 2;
    auVar102._0_8_ = 0x200000002;
    auVar102._12_4_ = 2;
    auVar102._16_4_ = 2;
    auVar102._20_4_ = 2;
    auVar102._24_4_ = 2;
    auVar102._28_4_ = 2;
    auVar96 = vpermps_avx512vl(auVar102,auVar106);
    auVar97 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar98 = vpermps_avx512vl(auVar97,auVar106);
    auVar99 = vpermps_avx512vl(auVar102,auVar100);
    auVar100 = vpermps_avx512vl(auVar97,auVar100);
    auVar106 = vpermps_avx2(auVar102,auVar101);
    auVar101 = vpermps_avx512vl(auVar97,auVar101);
    auVar102 = vpermps_avx512vl(auVar102,auVar103);
    auVar97 = vpermps_avx512vl(auVar97,auVar103);
    auVar66 = vfmadd132ps_fma(auVar107,auVar104,_DAT_01f7b040);
    auVar107 = vsubps_avx(auVar110,ZEXT1632(auVar66));
    auVar103 = vmulps_avx512vl(auVar90,ZEXT1632(auVar66));
    auVar110 = ZEXT1632(auVar66);
    auVar104 = vmulps_avx512vl(auVar91,auVar110);
    auVar63 = vfmadd231ps_fma(auVar103,auVar107,auVar108);
    auVar68 = vfmadd231ps_fma(auVar104,auVar107,auVar105);
    auVar103 = vmulps_avx512vl(auVar92,auVar110);
    auVar104 = vmulps_avx512vl(auVar93,auVar110);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar107,auVar90);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar107,auVar91);
    auVar90 = vmulps_avx512vl(auVar94,auVar110);
    auVar108 = ZEXT1632(auVar66);
    auVar91 = vmulps_avx512vl(auVar95,auVar108);
    auVar92 = vfmadd231ps_avx512vl(auVar90,auVar107,auVar92);
    auVar93 = vfmadd231ps_avx512vl(auVar91,auVar107,auVar93);
    fVar233 = auVar66._0_4_;
    fVar234 = auVar66._4_4_;
    auVar90._4_4_ = fVar234 * auVar103._4_4_;
    auVar90._0_4_ = fVar233 * auVar103._0_4_;
    fVar236 = auVar66._8_4_;
    auVar90._8_4_ = fVar236 * auVar103._8_4_;
    fVar246 = auVar66._12_4_;
    auVar90._12_4_ = fVar246 * auVar103._12_4_;
    auVar90._16_4_ = auVar103._16_4_ * 0.0;
    auVar90._20_4_ = auVar103._20_4_ * 0.0;
    auVar90._24_4_ = auVar103._24_4_ * 0.0;
    auVar90._28_4_ = fVar224;
    auVar91._4_4_ = fVar234 * auVar104._4_4_;
    auVar91._0_4_ = fVar233 * auVar104._0_4_;
    auVar91._8_4_ = fVar236 * auVar104._8_4_;
    auVar91._12_4_ = fVar246 * auVar104._12_4_;
    auVar91._16_4_ = auVar104._16_4_ * 0.0;
    auVar91._20_4_ = auVar104._20_4_ * 0.0;
    auVar91._24_4_ = auVar104._24_4_ * 0.0;
    auVar91._28_4_ = auVar105._28_4_;
    auVar63 = vfmadd231ps_fma(auVar90,auVar107,ZEXT1632(auVar63));
    auVar68 = vfmadd231ps_fma(auVar91,auVar107,ZEXT1632(auVar68));
    auVar95._0_4_ = fVar233 * auVar92._0_4_;
    auVar95._4_4_ = fVar234 * auVar92._4_4_;
    auVar95._8_4_ = fVar236 * auVar92._8_4_;
    auVar95._12_4_ = fVar246 * auVar92._12_4_;
    auVar95._16_4_ = auVar92._16_4_ * 0.0;
    auVar95._20_4_ = auVar92._20_4_ * 0.0;
    auVar95._24_4_ = auVar92._24_4_ * 0.0;
    auVar95._28_4_ = 0;
    auVar105._4_4_ = fVar234 * auVar93._4_4_;
    auVar105._0_4_ = fVar233 * auVar93._0_4_;
    auVar105._8_4_ = fVar236 * auVar93._8_4_;
    auVar105._12_4_ = fVar246 * auVar93._12_4_;
    auVar105._16_4_ = auVar93._16_4_ * 0.0;
    auVar105._20_4_ = auVar93._20_4_ * 0.0;
    auVar105._24_4_ = auVar93._24_4_ * 0.0;
    auVar105._28_4_ = auVar92._28_4_;
    auVar69 = vfmadd231ps_fma(auVar95,auVar107,auVar103);
    auVar70 = vfmadd231ps_fma(auVar105,auVar107,auVar104);
    auVar92._28_4_ = auVar104._28_4_;
    auVar92._0_28_ =
         ZEXT1628(CONCAT412(fVar246 * auVar70._12_4_,
                            CONCAT48(fVar236 * auVar70._8_4_,
                                     CONCAT44(fVar234 * auVar70._4_4_,fVar233 * auVar70._0_4_))));
    auVar76 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar246 * auVar69._12_4_,
                                                 CONCAT48(fVar236 * auVar69._8_4_,
                                                          CONCAT44(fVar234 * auVar69._4_4_,
                                                                   fVar233 * auVar69._0_4_)))),
                              auVar107,ZEXT1632(auVar63));
    auVar85 = vfmadd231ps_fma(auVar92,auVar107,ZEXT1632(auVar68));
    auVar105 = vsubps_avx(ZEXT1632(auVar69),ZEXT1632(auVar63));
    auVar90 = vsubps_avx(ZEXT1632(auVar70),ZEXT1632(auVar68));
    auVar91 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar105 = vmulps_avx512vl(auVar105,auVar91);
    auVar90 = vmulps_avx512vl(auVar90,auVar91);
    auVar103._0_4_ = fVar235 * auVar105._0_4_;
    auVar103._4_4_ = fVar235 * auVar105._4_4_;
    auVar103._8_4_ = fVar235 * auVar105._8_4_;
    auVar103._12_4_ = fVar235 * auVar105._12_4_;
    auVar103._16_4_ = fVar235 * auVar105._16_4_;
    auVar103._20_4_ = fVar235 * auVar105._20_4_;
    auVar103._24_4_ = fVar235 * auVar105._24_4_;
    auVar103._28_4_ = 0;
    auVar105 = vmulps_avx512vl(auVar109,auVar90);
    auVar68 = vxorps_avx512vl(auVar94._0_16_,auVar94._0_16_);
    auVar90 = vpermt2ps_avx512vl(ZEXT1632(auVar76),_DAT_01fb9fc0,ZEXT1632(auVar68));
    auVar92 = vpermt2ps_avx512vl(ZEXT1632(auVar85),_DAT_01fb9fc0,ZEXT1632(auVar68));
    auVar146._0_4_ = auVar103._0_4_ + auVar76._0_4_;
    auVar146._4_4_ = auVar103._4_4_ + auVar76._4_4_;
    auVar146._8_4_ = auVar103._8_4_ + auVar76._8_4_;
    auVar146._12_4_ = auVar103._12_4_ + auVar76._12_4_;
    auVar146._16_4_ = auVar103._16_4_ + 0.0;
    auVar146._20_4_ = auVar103._20_4_ + 0.0;
    auVar146._24_4_ = auVar103._24_4_ + 0.0;
    auVar146._28_4_ = 0;
    auVar104 = ZEXT1632(auVar68);
    auVar93 = vpermt2ps_avx512vl(auVar103,_DAT_01fb9fc0,auVar104);
    auVar94 = vaddps_avx512vl(ZEXT1632(auVar85),auVar105);
    auVar95 = vpermt2ps_avx512vl(auVar105,_DAT_01fb9fc0,auVar104);
    auVar105 = vsubps_avx(auVar90,auVar93);
    auVar95 = vsubps_avx512vl(auVar92,auVar95);
    auVar93 = vmulps_avx512vl(auVar99,auVar108);
    auVar103 = vmulps_avx512vl(auVar100,auVar108);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar107,auVar96);
    auVar96 = vfmadd231ps_avx512vl(auVar103,auVar107,auVar98);
    auVar98 = vmulps_avx512vl(auVar106,auVar108);
    auVar103 = vmulps_avx512vl(auVar101,auVar108);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar107,auVar99);
    auVar99 = vfmadd231ps_avx512vl(auVar103,auVar107,auVar100);
    auVar100 = vmulps_avx512vl(auVar102,auVar108);
    auVar97 = vmulps_avx512vl(auVar97,auVar108);
    auVar63 = vfmadd231ps_fma(auVar100,auVar107,auVar106);
    auVar106 = vfmadd231ps_avx512vl(auVar97,auVar107,auVar101);
    auVar97 = vmulps_avx512vl(auVar108,auVar98);
    auVar102 = ZEXT1632(auVar66);
    auVar100 = vmulps_avx512vl(auVar102,auVar99);
    auVar93 = vfmadd231ps_avx512vl(auVar97,auVar107,auVar93);
    auVar96 = vfmadd231ps_avx512vl(auVar100,auVar107,auVar96);
    auVar106 = vmulps_avx512vl(auVar102,auVar106);
    auVar97 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar246 * auVar63._12_4_,
                                            CONCAT48(fVar236 * auVar63._8_4_,
                                                     CONCAT44(fVar234 * auVar63._4_4_,
                                                              fVar233 * auVar63._0_4_)))),auVar107,
                         auVar98);
    auVar98 = vfmadd231ps_avx512vl(auVar106,auVar107,auVar99);
    auVar106._4_4_ = fVar234 * auVar97._4_4_;
    auVar106._0_4_ = fVar233 * auVar97._0_4_;
    auVar106._8_4_ = fVar236 * auVar97._8_4_;
    auVar106._12_4_ = fVar246 * auVar97._12_4_;
    auVar106._16_4_ = auVar97._16_4_ * 0.0;
    auVar106._20_4_ = auVar97._20_4_ * 0.0;
    auVar106._24_4_ = auVar97._24_4_ * 0.0;
    auVar106._28_4_ = auVar101._28_4_;
    auVar99 = vmulps_avx512vl(auVar102,auVar98);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar107,auVar93);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar96,auVar107);
    auVar107 = vsubps_avx512vl(auVar97,auVar93);
    auVar93 = vsubps_avx512vl(auVar98,auVar96);
    auVar96 = vmulps_avx512vl(auVar107,auVar91);
    auVar91 = vmulps_avx512vl(auVar93,auVar91);
    fVar224 = fVar235 * auVar96._0_4_;
    fVar233 = fVar235 * auVar96._4_4_;
    auVar107._4_4_ = fVar233;
    auVar107._0_4_ = fVar224;
    fVar234 = fVar235 * auVar96._8_4_;
    auVar107._8_4_ = fVar234;
    fVar236 = fVar235 * auVar96._12_4_;
    auVar107._12_4_ = fVar236;
    fVar246 = fVar235 * auVar96._16_4_;
    auVar107._16_4_ = fVar246;
    fVar247 = fVar235 * auVar96._20_4_;
    auVar107._20_4_ = fVar247;
    fVar235 = fVar235 * auVar96._24_4_;
    auVar107._24_4_ = fVar235;
    auVar107._28_4_ = auVar96._28_4_;
    auVar91 = vmulps_avx512vl(auVar109,auVar91);
    auVar97 = vpermt2ps_avx512vl(auVar106,_DAT_01fb9fc0,auVar104);
    auVar98 = vpermt2ps_avx512vl(auVar99,_DAT_01fb9fc0,auVar104);
    auVar223._0_4_ = auVar106._0_4_ + fVar224;
    auVar223._4_4_ = auVar106._4_4_ + fVar233;
    auVar223._8_4_ = auVar106._8_4_ + fVar234;
    auVar223._12_4_ = auVar106._12_4_ + fVar236;
    auVar223._16_4_ = auVar106._16_4_ + fVar246;
    auVar223._20_4_ = auVar106._20_4_ + fVar247;
    auVar223._24_4_ = auVar106._24_4_ + fVar235;
    auVar223._28_4_ = auVar106._28_4_ + auVar96._28_4_;
    auVar107 = vpermt2ps_avx512vl(auVar107,_DAT_01fb9fc0,ZEXT1632(auVar68));
    auVar96 = vaddps_avx512vl(auVar99,auVar91);
    auVar91 = vpermt2ps_avx512vl(auVar91,_DAT_01fb9fc0,ZEXT1632(auVar68));
    auVar107 = vsubps_avx(auVar97,auVar107);
    auVar91 = vsubps_avx512vl(auVar98,auVar91);
    auVar164 = ZEXT1632(auVar76);
    auVar93 = vsubps_avx512vl(auVar106,auVar164);
    auVar176 = ZEXT1632(auVar85);
    auVar100 = vsubps_avx512vl(auVar99,auVar176);
    auVar101 = vsubps_avx512vl(auVar97,auVar90);
    auVar93 = vaddps_avx512vl(auVar93,auVar101);
    auVar101 = vsubps_avx512vl(auVar98,auVar92);
    auVar100 = vaddps_avx512vl(auVar100,auVar101);
    auVar101 = vmulps_avx512vl(auVar176,auVar93);
    auVar101 = vfnmadd231ps_avx512vl(auVar101,auVar164,auVar100);
    auVar102 = vmulps_avx512vl(auVar94,auVar93);
    auVar102 = vfnmadd231ps_avx512vl(auVar102,auVar146,auVar100);
    auVar103 = vmulps_avx512vl(auVar95,auVar93);
    auVar103 = vfnmadd231ps_avx512vl(auVar103,auVar105,auVar100);
    auVar104 = vmulps_avx512vl(auVar92,auVar93);
    auVar104 = vfnmadd231ps_avx512vl(auVar104,auVar90,auVar100);
    auVar108 = vmulps_avx512vl(auVar99,auVar93);
    auVar108 = vfnmadd231ps_avx512vl(auVar108,auVar106,auVar100);
    auVar109 = vmulps_avx512vl(auVar96,auVar93);
    auVar109 = vfnmadd231ps_avx512vl(auVar109,auVar223,auVar100);
    auVar110 = vmulps_avx512vl(auVar91,auVar93);
    auVar110 = vfnmadd231ps_avx512vl(auVar110,auVar107,auVar100);
    auVar93 = vmulps_avx512vl(auVar98,auVar93);
    auVar93 = vfnmadd231ps_avx512vl(auVar93,auVar97,auVar100);
    auVar100 = vminps_avx512vl(auVar101,auVar102);
    auVar101 = vmaxps_avx512vl(auVar101,auVar102);
    auVar102 = vminps_avx512vl(auVar103,auVar104);
    auVar100 = vminps_avx512vl(auVar100,auVar102);
    auVar102 = vmaxps_avx512vl(auVar103,auVar104);
    auVar101 = vmaxps_avx512vl(auVar101,auVar102);
    auVar102 = vminps_avx512vl(auVar108,auVar109);
    auVar103 = vmaxps_avx512vl(auVar108,auVar109);
    auVar104 = vminps_avx512vl(auVar110,auVar93);
    auVar102 = vminps_avx512vl(auVar102,auVar104);
    auVar100 = vminps_avx512vl(auVar100,auVar102);
    auVar93 = vmaxps_avx512vl(auVar110,auVar93);
    auVar93 = vmaxps_avx512vl(auVar103,auVar93);
    auVar101 = vmaxps_avx512vl(auVar101,auVar93);
    auVar265 = ZEXT3264(auVar101);
    uVar21 = vcmpps_avx512vl(auVar100,local_440,2);
    auVar93._4_4_ = uStack_3bc;
    auVar93._0_4_ = local_3c0;
    auVar93._8_4_ = uStack_3b8;
    auVar93._12_4_ = uStack_3b4;
    auVar93._16_4_ = uStack_3b0;
    auVar93._20_4_ = uStack_3ac;
    auVar93._24_4_ = uStack_3a8;
    auVar93._28_4_ = uStack_3a4;
    uVar22 = vcmpps_avx512vl(auVar101,auVar93,5);
    bVar46 = (byte)uVar21 & (byte)uVar22 & 0x7f;
    if (bVar46 == 0) {
      auVar107 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar266 = ZEXT3264(auVar107);
      auVar60 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar267 = ZEXT1664(auVar60);
      auVar123._32_32_ = auVar111._32_32_;
      auVar123._0_32_ = _DAT_01fb9fe0;
      auVar268 = ZEXT3264(_DAT_01fb9fe0);
    }
    else {
      auVar100 = vsubps_avx512vl(auVar90,auVar164);
      auVar101 = vsubps_avx512vl(auVar92,auVar176);
      auVar102 = vsubps_avx512vl(auVar97,auVar106);
      auVar100 = vaddps_avx512vl(auVar100,auVar102);
      auVar265 = ZEXT3264(auVar100);
      auVar102 = vsubps_avx512vl(auVar98,auVar99);
      auVar101 = vaddps_avx512vl(auVar101,auVar102);
      auVar102 = vmulps_avx512vl(auVar176,auVar100);
      auVar102 = vfnmadd231ps_avx512vl(auVar102,auVar101,auVar164);
      auVar94 = vmulps_avx512vl(auVar94,auVar100);
      auVar94 = vfnmadd213ps_avx512vl(auVar146,auVar101,auVar94);
      auVar95 = vmulps_avx512vl(auVar95,auVar100);
      auVar95 = vfnmadd213ps_avx512vl(auVar105,auVar101,auVar95);
      auVar105 = vmulps_avx512vl(auVar92,auVar100);
      auVar92 = vfnmadd231ps_avx512vl(auVar105,auVar101,auVar90);
      auVar105 = vmulps_avx512vl(auVar99,auVar100);
      auVar99 = vfnmadd231ps_avx512vl(auVar105,auVar101,auVar106);
      auVar105 = vmulps_avx512vl(auVar96,auVar100);
      auVar96 = vfnmadd213ps_avx512vl(auVar223,auVar101,auVar105);
      auVar105 = vmulps_avx512vl(auVar91,auVar100);
      auVar103 = vfnmadd213ps_avx512vl(auVar107,auVar101,auVar105);
      auVar107 = vmulps_avx512vl(auVar98,auVar100);
      auVar97 = vfnmadd231ps_avx512vl(auVar107,auVar97,auVar101);
      auVar105 = vminps_avx(auVar102,auVar94);
      auVar107 = vmaxps_avx(auVar102,auVar94);
      auVar90 = vminps_avx(auVar95,auVar92);
      auVar90 = vminps_avx(auVar105,auVar90);
      auVar105 = vmaxps_avx(auVar95,auVar92);
      auVar107 = vmaxps_avx(auVar107,auVar105);
      auVar106 = vminps_avx(auVar99,auVar96);
      auVar105 = vmaxps_avx(auVar99,auVar96);
      auVar91 = vminps_avx(auVar103,auVar97);
      auVar106 = vminps_avx(auVar106,auVar91);
      auVar106 = vminps_avx(auVar90,auVar106);
      auVar90 = vmaxps_avx(auVar103,auVar97);
      auVar105 = vmaxps_avx(auVar105,auVar90);
      auVar107 = vmaxps_avx(auVar107,auVar105);
      uVar21 = vcmpps_avx512vl(auVar107,auVar93,5);
      uVar22 = vcmpps_avx512vl(auVar106,local_440,2);
      bVar46 = bVar46 & (byte)uVar21 & (byte)uVar22;
      if (bVar46 != 0) {
        auStack_5f0[uVar48] = (uint)bVar46;
        uVar21 = vmovlps_avx(auVar60);
        (&uStack_420)[uVar48] = uVar21;
        uVar54 = vmovlps_avx(auVar87);
        auStack_3a0[uVar48] = uVar54;
        uVar48 = (ulong)((int)uVar48 + 1);
      }
      auVar107 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar266 = ZEXT3264(auVar107);
      auVar60 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar267 = ZEXT1664(auVar60);
      auVar123._32_32_ = auVar111._32_32_;
      auVar123._0_32_ = _DAT_01fb9fe0;
      auVar268 = ZEXT3264(_DAT_01fb9fe0);
    }
LAB_01819c23:
    do {
      do {
        do {
          auVar66 = SUB6416(ZEXT464(0xb8d1b717),0);
          if ((int)uVar48 == 0) {
            uVar132 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar29._4_4_ = uVar132;
            auVar29._0_4_ = uVar132;
            auVar29._8_4_ = uVar132;
            auVar29._12_4_ = uVar132;
            uVar21 = vcmpps_avx512vl(local_5e0,auVar29,2);
            uVar53 = (ulong)((uint)uVar53 & (uint)uVar21);
            goto LAB_01818f64;
          }
          uVar47 = (int)uVar48 - 1;
          uVar49 = (ulong)uVar47;
          uVar5 = auStack_5f0[uVar49];
          auVar87._8_8_ = 0;
          auVar87._0_8_ = auStack_3a0[uVar49];
          uVar54 = 0;
          for (uVar52 = (ulong)uVar5; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x8000000000000000)
          {
            uVar54 = uVar54 + 1;
          }
          uVar51 = uVar5 - 1 & uVar5;
          bVar57 = uVar51 == 0;
          auStack_5f0[uVar49] = uVar51;
          if (bVar57) {
            uVar48 = (ulong)uVar47;
          }
          auVar127._8_8_ = 0;
          auVar127._0_8_ = uVar54;
          auVar60 = vpunpcklqdq_avx(auVar127,ZEXT416((int)uVar54 + 1));
          auVar111._32_32_ = auVar123._32_32_;
          auVar60 = vcvtqq2ps_avx512vl(auVar60);
          auVar60 = vmulps_avx512vl(auVar60,auVar267._0_16_);
          uVar132 = *(undefined4 *)((long)&uStack_420 + uVar49 * 8 + 4);
          auVar23._4_4_ = uVar132;
          auVar23._0_4_ = uVar132;
          auVar23._8_4_ = uVar132;
          auVar23._12_4_ = uVar132;
          auVar63 = vmulps_avx512vl(auVar60,auVar23);
          auVar68 = auVar270._0_16_;
          auVar60 = vsubps_avx512vl(auVar68,auVar60);
          uVar132 = *(undefined4 *)(&uStack_420 + uVar49);
          auVar24._4_4_ = uVar132;
          auVar24._0_4_ = uVar132;
          auVar24._8_4_ = uVar132;
          auVar24._12_4_ = uVar132;
          auVar60 = vfmadd231ps_avx512vl(auVar63,auVar60,auVar24);
          auVar63 = vmovshdup_avx(auVar60);
          fVar235 = auVar63._0_4_ - auVar60._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar235));
          if (uVar5 == 0 || bVar57) goto LAB_018196d9;
          auVar63 = vshufps_avx(auVar87,auVar87,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar235));
          bVar55 = (uint)uVar48 < 4;
          uVar47 = (uint)uVar48 - 4;
          bVar58 = uVar47 == 0;
          bVar56 = (POPCOUNT(uVar47 & 0xff) & 1U) == 0;
          auVar76 = vsubps_avx512vl(auVar68,auVar63);
          fVar224 = auVar63._0_4_;
          auVar171._0_4_ = fVar224 * fVar139;
          fVar233 = auVar63._4_4_;
          auVar171._4_4_ = fVar233 * fVar147;
          fVar234 = auVar63._8_4_;
          auVar171._8_4_ = fVar234 * fVar139;
          fVar236 = auVar63._12_4_;
          auVar171._12_4_ = fVar236 * fVar147;
          auVar185._0_4_ = fVar224 * fVar148;
          auVar185._4_4_ = fVar233 * fVar149;
          auVar185._8_4_ = fVar234 * fVar148;
          auVar185._12_4_ = fVar236 * fVar149;
          auVar192._0_4_ = fVar224 * fVar160;
          auVar192._4_4_ = fVar233 * fVar165;
          auVar192._8_4_ = fVar234 * fVar160;
          auVar192._12_4_ = fVar236 * fVar165;
          auVar155._0_4_ = fVar224 * fVar166;
          auVar155._4_4_ = fVar233 * fVar167;
          auVar155._8_4_ = fVar234 * fVar166;
          auVar155._12_4_ = fVar236 * fVar167;
          auVar63 = vfmadd231ps_fma(auVar171,auVar76,auVar61);
          auVar69 = vfmadd231ps_fma(auVar185,auVar76,auVar73);
          auVar70 = vfmadd231ps_fma(auVar192,auVar76,auVar75);
          auVar76 = vfmadd231ps_fma(auVar155,auVar76,auVar71);
          auVar97._16_16_ = auVar63;
          auVar97._0_16_ = auVar63;
          auVar98._16_16_ = auVar69;
          auVar98._0_16_ = auVar69;
          auVar100._16_16_ = auVar70;
          auVar100._0_16_ = auVar70;
          auVar105 = vpermps_avx512vl(auVar268._0_32_,ZEXT1632(auVar60));
          auVar107 = vsubps_avx(auVar98,auVar97);
          auVar69 = vfmadd213ps_fma(auVar107,auVar105,auVar97);
          auVar107 = vsubps_avx(auVar100,auVar98);
          auVar85 = vfmadd213ps_fma(auVar107,auVar105,auVar98);
          auVar63 = vsubps_avx(auVar76,auVar70);
          auVar99._16_16_ = auVar63;
          auVar99._0_16_ = auVar63;
          auVar63 = vfmadd213ps_fma(auVar99,auVar105,auVar100);
          auVar107 = vsubps_avx(ZEXT1632(auVar85),ZEXT1632(auVar69));
          auVar69 = vfmadd213ps_fma(auVar107,auVar105,ZEXT1632(auVar69));
          auVar107 = vsubps_avx(ZEXT1632(auVar63),ZEXT1632(auVar85));
          auVar63 = vfmadd213ps_fma(auVar107,auVar105,ZEXT1632(auVar85));
          auVar107 = vsubps_avx(ZEXT1632(auVar63),ZEXT1632(auVar69));
          auVar88 = vfmadd231ps_fma(ZEXT1632(auVar69),auVar107,auVar105);
          auVar111._0_32_ = vmulps_avx512vl(auVar107,auVar266._0_32_);
          auVar123._16_48_ = auVar111._16_48_;
          auVar63 = vmulss_avx512f(ZEXT416((uint)fVar235),SUB6416(ZEXT464(0x3eaaaaab),0));
          fVar224 = auVar63._0_4_;
          auVar193._0_8_ =
               CONCAT44(auVar88._4_4_ + fVar224 * auVar111._4_4_,
                        auVar88._0_4_ + fVar224 * auVar111._0_4_);
          auVar193._8_4_ = auVar88._8_4_ + fVar224 * auVar111._8_4_;
          auVar193._12_4_ = auVar88._12_4_ + fVar224 * auVar111._12_4_;
          auVar172._0_4_ = fVar224 * auVar111._16_4_;
          auVar172._4_4_ = fVar224 * auVar111._20_4_;
          auVar172._8_4_ = fVar224 * auVar111._24_4_;
          auVar172._12_4_ = fVar224 * auVar111._28_4_;
          auVar82 = vsubps_avx((undefined1  [16])0x0,auVar172);
          auVar85 = vshufpd_avx(auVar88,auVar88,3);
          auVar89 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar63 = vsubps_avx(auVar85,auVar88);
          auVar69 = vsubps_avx(auVar89,(undefined1  [16])0x0);
          auVar212._0_4_ = auVar63._0_4_ + auVar69._0_4_;
          auVar212._4_4_ = auVar63._4_4_ + auVar69._4_4_;
          auVar212._8_4_ = auVar63._8_4_ + auVar69._8_4_;
          auVar212._12_4_ = auVar63._12_4_ + auVar69._12_4_;
          auVar63 = vshufps_avx(auVar88,auVar88,0xb1);
          auVar69 = vshufps_avx(auVar193,auVar193,0xb1);
          auVar70 = vshufps_avx(auVar82,auVar82,0xb1);
          auVar76 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar259._4_4_ = auVar212._0_4_;
          auVar259._0_4_ = auVar212._0_4_;
          auVar259._8_4_ = auVar212._0_4_;
          auVar259._12_4_ = auVar212._0_4_;
          auVar79 = vshufps_avx(auVar212,auVar212,0x55);
          fVar224 = auVar79._0_4_;
          auVar221._0_4_ = auVar63._0_4_ * fVar224;
          fVar233 = auVar79._4_4_;
          auVar221._4_4_ = auVar63._4_4_ * fVar233;
          fVar234 = auVar79._8_4_;
          auVar221._8_4_ = auVar63._8_4_ * fVar234;
          fVar236 = auVar79._12_4_;
          auVar221._12_4_ = auVar63._12_4_ * fVar236;
          auVar226._0_4_ = auVar69._0_4_ * fVar224;
          auVar226._4_4_ = auVar69._4_4_ * fVar233;
          auVar226._8_4_ = auVar69._8_4_ * fVar234;
          auVar226._12_4_ = auVar69._12_4_ * fVar236;
          auVar238._0_4_ = auVar70._0_4_ * fVar224;
          auVar238._4_4_ = auVar70._4_4_ * fVar233;
          auVar238._8_4_ = auVar70._8_4_ * fVar234;
          auVar238._12_4_ = auVar70._12_4_ * fVar236;
          auVar213._0_4_ = auVar76._0_4_ * fVar224;
          auVar213._4_4_ = auVar76._4_4_ * fVar233;
          auVar213._8_4_ = auVar76._8_4_ * fVar234;
          auVar213._12_4_ = auVar76._12_4_ * fVar236;
          auVar63 = vfmadd231ps_fma(auVar221,auVar259,auVar88);
          auVar69 = vfmadd231ps_fma(auVar226,auVar259,auVar193);
          auVar81 = vfmadd231ps_fma(auVar238,auVar259,auVar82);
          auVar83 = vfmadd231ps_fma(auVar213,(undefined1  [16])0x0,auVar259);
          auVar79 = vshufpd_avx(auVar63,auVar63,1);
          auVar80 = vshufpd_avx(auVar69,auVar69,1);
          auVar77 = vshufpd_avx512vl(auVar81,auVar81,1);
          auVar78 = vshufpd_avx512vl(auVar83,auVar83,1);
          auVar70 = vminss_avx(auVar63,auVar69);
          auVar63 = vmaxss_avx(auVar69,auVar63);
          auVar76 = vminss_avx(auVar81,auVar83);
          auVar69 = vmaxss_avx(auVar83,auVar81);
          auVar70 = vminss_avx(auVar70,auVar76);
          auVar63 = vmaxss_avx(auVar69,auVar63);
          auVar76 = vminss_avx(auVar79,auVar80);
          auVar69 = vmaxss_avx(auVar80,auVar79);
          auVar79 = vminss_avx512f(auVar77,auVar78);
          auVar80 = vmaxss_avx512f(auVar78,auVar77);
          vmaxss_avx(auVar80,auVar69);
          auVar123._0_16_ = vminss_avx512f(auVar76,auVar79);
          vucomiss_avx512f(auVar70);
          if ((!bVar55 && !bVar58) &&
             (auVar69 = vucomiss_avx512f(auVar66), bVar59 = bVar58, !bVar55 && !bVar58)) break;
          auVar69 = vucomiss_avx512f(auVar66);
          auVar76 = vucomiss_avx512f(auVar123._0_16_);
          auVar63 = vucomiss_avx512f(auVar66);
          bVar59 = bVar55 || bVar58;
          bVar56 = bVar55 || bVar58;
          if (!bVar55 && !bVar58) break;
          uVar21 = vcmpps_avx512vl(auVar70,auVar76,5);
          uVar22 = vcmpps_avx512vl(auVar123._0_16_,auVar76,5);
          uVar47 = (uint)uVar21 & (uint)uVar22;
          bVar10 = (uVar47 & 1) == 0;
          bVar59 = (!bVar55 && !bVar58) && bVar10;
          bVar56 = (!bVar55 && !bVar58) && (uVar47 & 1) == 0;
        } while ((bVar55 || bVar58) || !bVar10);
        auVar79 = vxorps_avx512vl(auVar271._0_16_,auVar271._0_16_);
        auVar271 = ZEXT1664(auVar79);
        vcmpss_avx512f(auVar70,auVar79,1);
        uVar21 = vcmpss_avx512f(auVar63,auVar79,1);
        bVar58 = (bool)((byte)uVar21 & 1);
        auVar112._16_48_ = auVar123._16_48_;
        auVar112._0_16_ = auVar131._0_16_;
        auVar124._4_60_ = auVar112._4_60_;
        auVar124._0_4_ = (float)((uint)bVar58 * -0x40800000 + (uint)!bVar58 * auVar131._0_4_);
        vucomiss_avx512f(auVar124._0_16_);
        bVar56 = (bool)(!bVar59 | bVar56);
        bVar59 = bVar56 == false;
        auVar114._16_48_ = auVar123._16_48_;
        auVar114._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar113._4_60_ = auVar114._4_60_;
        auVar113._0_4_ = (uint)bVar56 * auVar79._0_4_ + (uint)!bVar56 * 0x7f800000;
        auVar76 = auVar113._0_16_;
        auVar116._16_48_ = auVar123._16_48_;
        auVar116._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar115._4_60_ = auVar116._4_60_;
        auVar115._0_4_ = (uint)bVar56 * auVar79._0_4_ + (uint)!bVar56 * -0x800000;
        auVar66 = auVar115._0_16_;
        auVar80 = vxorps_avx512vl(auVar265._0_16_,auVar265._0_16_);
        auVar265 = ZEXT1664(auVar80);
        uVar21 = vcmpss_avx512f(auVar123._0_16_,auVar79,1);
        bVar58 = (bool)((byte)uVar21 & 1);
        auVar118._16_48_ = auVar123._16_48_;
        auVar118._0_16_ = auVar131._0_16_;
        auVar117._4_60_ = auVar118._4_60_;
        auVar117._0_4_ = (float)((uint)bVar58 * -0x40800000 + (uint)!bVar58 * auVar131._0_4_);
        vucomiss_avx512f(auVar117._0_16_);
        if ((bVar56) || (bVar59)) {
          auVar79 = vucomiss_avx512f(auVar70);
          if ((bVar56) || (bVar59)) {
            auVar28._8_4_ = 0x80000000;
            auVar28._0_8_ = 0x8000000080000000;
            auVar28._12_4_ = 0x80000000;
            auVar81 = vxorps_avx512vl(auVar70,auVar28);
            auVar70 = vsubss_avx512f(auVar79,auVar70);
            auVar70 = vdivss_avx512f(auVar81,auVar70);
            auVar79 = vsubss_avx512f(ZEXT416(0x3f800000),auVar70);
            auVar79 = vfmadd213ss_avx512f(auVar79,auVar80,auVar70);
            auVar70 = auVar79;
          }
          else {
            auVar70 = vxorps_avx512vl(auVar79,auVar79);
            vucomiss_avx512f(auVar70);
            auVar79 = ZEXT416(0x3f800000);
            if ((bVar56) || (bVar59)) {
              auVar79 = SUB6416(ZEXT464(0xff800000),0);
              auVar70 = ZEXT416(0x7f800000);
            }
          }
          auVar76 = vminss_avx512f(auVar76,auVar70);
          auVar66 = vmaxss_avx(auVar79,auVar66);
        }
        auVar131 = ZEXT464(0x3f800000);
        uVar21 = vcmpss_avx512f(auVar69,auVar80,1);
        bVar56 = (bool)((byte)uVar21 & 1);
        auVar70 = auVar131._0_16_;
        fVar224 = (float)((uint)bVar56 * -0x40800000 + (uint)!bVar56 * 0x3f800000);
        if ((auVar124._0_4_ != fVar224) || (NAN(auVar124._0_4_) || NAN(fVar224))) {
          fVar234 = auVar69._0_4_;
          fVar233 = auVar63._0_4_;
          if ((fVar234 != fVar233) || (NAN(fVar234) || NAN(fVar233))) {
            auVar27._8_4_ = 0x80000000;
            auVar27._0_8_ = 0x8000000080000000;
            auVar27._12_4_ = 0x80000000;
            auVar63 = vxorps_avx512vl(auVar63,auVar27);
            auVar214._0_4_ = auVar63._0_4_ / (fVar234 - fVar233);
            auVar214._4_12_ = auVar63._4_12_;
            auVar63 = vsubss_avx512f(auVar70,auVar214);
            auVar63 = vfmadd213ss_avx512f(auVar63,auVar80,auVar214);
            auVar69 = auVar63;
          }
          else if ((fVar233 != 0.0) ||
                  (auVar63 = auVar70, auVar69 = ZEXT816(0) << 0x40, NAN(fVar233))) {
            auVar63 = SUB6416(ZEXT464(0xff800000),0);
            auVar69 = SUB6416(ZEXT464(0x7f800000),0);
          }
          auVar76 = vminss_avx(auVar76,auVar69);
          auVar66 = vmaxss_avx(auVar63,auVar66);
        }
        bVar56 = auVar117._0_4_ != fVar224;
        auVar63 = vminss_avx512f(auVar76,auVar70);
        auVar120._16_48_ = auVar123._16_48_;
        auVar120._0_16_ = auVar76;
        auVar119._4_60_ = auVar120._4_60_;
        auVar119._0_4_ = (uint)bVar56 * auVar63._0_4_ + (uint)!bVar56 * auVar76._0_4_;
        auVar63 = vmaxss_avx512f(auVar70,auVar66);
        auVar122._16_48_ = auVar123._16_48_;
        auVar122._0_16_ = auVar66;
        auVar121._4_60_ = auVar122._4_60_;
        auVar121._0_4_ = (uint)bVar56 * auVar63._0_4_ + (uint)!bVar56 * auVar66._0_4_;
        auVar66 = vmaxss_avx512f(auVar80,auVar119._0_16_);
        auVar123._0_16_ = vminss_avx512f(auVar121._0_16_,auVar70);
      } while (auVar123._0_4_ < auVar66._0_4_);
      auVar76 = vmaxss_avx512f(auVar80,ZEXT416((uint)(auVar66._0_4_ + -0.1)));
      auVar81 = vminss_avx512f(ZEXT416((uint)(auVar123._0_4_ + 0.1)),auVar70);
      auVar156._0_8_ = auVar88._0_8_;
      auVar156._8_8_ = auVar156._0_8_;
      auVar227._8_8_ = auVar193._0_8_;
      auVar227._0_8_ = auVar193._0_8_;
      auVar239._8_8_ = auVar82._0_8_;
      auVar239._0_8_ = auVar82._0_8_;
      auVar66 = vshufpd_avx(auVar193,auVar193,3);
      auVar63 = vshufpd_avx(auVar82,auVar82,3);
      auVar69 = vshufps_avx(auVar76,auVar81,0);
      auVar82 = vsubps_avx512vl(auVar68,auVar69);
      fVar224 = auVar69._0_4_;
      auVar186._0_4_ = fVar224 * auVar85._0_4_;
      fVar233 = auVar69._4_4_;
      auVar186._4_4_ = fVar233 * auVar85._4_4_;
      fVar234 = auVar69._8_4_;
      auVar186._8_4_ = fVar234 * auVar85._8_4_;
      fVar236 = auVar69._12_4_;
      auVar186._12_4_ = fVar236 * auVar85._12_4_;
      auVar194._0_4_ = fVar224 * auVar66._0_4_;
      auVar194._4_4_ = fVar233 * auVar66._4_4_;
      auVar194._8_4_ = fVar234 * auVar66._8_4_;
      auVar194._12_4_ = fVar236 * auVar66._12_4_;
      auVar261._0_4_ = auVar63._0_4_ * fVar224;
      auVar261._4_4_ = auVar63._4_4_ * fVar233;
      auVar261._8_4_ = auVar63._8_4_ * fVar234;
      auVar261._12_4_ = auVar63._12_4_ * fVar236;
      auVar173._0_4_ = fVar224 * auVar89._0_4_;
      auVar173._4_4_ = fVar233 * auVar89._4_4_;
      auVar173._8_4_ = fVar234 * auVar89._8_4_;
      auVar173._12_4_ = fVar236 * auVar89._12_4_;
      auVar85 = vfmadd231ps_fma(auVar186,auVar82,auVar156);
      auVar89 = vfmadd231ps_fma(auVar194,auVar82,auVar227);
      auVar79 = vfmadd231ps_fma(auVar261,auVar82,auVar239);
      auVar82 = vfmadd231ps_fma(auVar173,auVar82,ZEXT816(0));
      auVar63 = vsubss_avx512f(auVar70,auVar76);
      auVar66 = vmovshdup_avx(auVar87);
      auVar77 = vfmadd231ss_fma(ZEXT416((uint)(auVar66._0_4_ * auVar76._0_4_)),auVar87,auVar63);
      auVar63 = vsubss_avx512f(auVar70,auVar81);
      auVar78 = vfmadd231ss_fma(ZEXT416((uint)(auVar66._0_4_ * auVar81._0_4_)),auVar87,auVar63);
      auVar81 = vdivss_avx512f(auVar70,ZEXT416((uint)fVar235));
      auVar66 = vsubps_avx(auVar89,auVar85);
      auVar83 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar69 = vmulps_avx512vl(auVar66,auVar83);
      auVar66 = vsubps_avx(auVar79,auVar89);
      auVar76 = vmulps_avx512vl(auVar66,auVar83);
      auVar66 = vsubps_avx(auVar82,auVar79);
      auVar66 = vmulps_avx512vl(auVar66,auVar83);
      auVar63 = vminps_avx(auVar76,auVar66);
      auVar66 = vmaxps_avx(auVar76,auVar66);
      auVar63 = vminps_avx(auVar69,auVar63);
      auVar66 = vmaxps_avx(auVar69,auVar66);
      auVar69 = vshufpd_avx(auVar63,auVar63,3);
      auVar76 = vshufpd_avx(auVar66,auVar66,3);
      auVar63 = vminps_avx(auVar63,auVar69);
      auVar66 = vmaxps_avx(auVar66,auVar76);
      fVar235 = auVar81._0_4_;
      auVar215._0_4_ = auVar63._0_4_ * fVar235;
      auVar215._4_4_ = auVar63._4_4_ * fVar235;
      auVar215._8_4_ = auVar63._8_4_ * fVar235;
      auVar215._12_4_ = auVar63._12_4_ * fVar235;
      auVar201._0_4_ = fVar235 * auVar66._0_4_;
      auVar201._4_4_ = fVar235 * auVar66._4_4_;
      auVar201._8_4_ = fVar235 * auVar66._8_4_;
      auVar201._12_4_ = fVar235 * auVar66._12_4_;
      auVar81 = vdivss_avx512f(auVar70,ZEXT416((uint)(auVar78._0_4_ - auVar77._0_4_)));
      auVar66 = vshufpd_avx(auVar85,auVar85,3);
      auVar63 = vshufpd_avx(auVar89,auVar89,3);
      auVar69 = vshufpd_avx(auVar79,auVar79,3);
      auVar76 = vshufpd_avx(auVar82,auVar82,3);
      auVar66 = vsubps_avx(auVar66,auVar85);
      auVar85 = vsubps_avx(auVar63,auVar89);
      auVar89 = vsubps_avx(auVar69,auVar79);
      auVar76 = vsubps_avx(auVar76,auVar82);
      auVar63 = vminps_avx(auVar66,auVar85);
      auVar66 = vmaxps_avx(auVar66,auVar85);
      auVar69 = vminps_avx(auVar89,auVar76);
      auVar69 = vminps_avx(auVar63,auVar69);
      auVar63 = vmaxps_avx(auVar89,auVar76);
      auVar66 = vmaxps_avx(auVar66,auVar63);
      fVar235 = auVar81._0_4_;
      auVar240._0_4_ = fVar235 * auVar69._0_4_;
      auVar240._4_4_ = fVar235 * auVar69._4_4_;
      auVar240._8_4_ = fVar235 * auVar69._8_4_;
      auVar240._12_4_ = fVar235 * auVar69._12_4_;
      auVar228._0_4_ = fVar235 * auVar66._0_4_;
      auVar228._4_4_ = fVar235 * auVar66._4_4_;
      auVar228._8_4_ = fVar235 * auVar66._8_4_;
      auVar228._12_4_ = fVar235 * auVar66._12_4_;
      auVar76 = vinsertps_avx(auVar60,auVar77,0x10);
      auVar84 = vpermt2ps_avx512vl(auVar60,_DAT_01fb9f90,auVar78);
      auVar138._0_4_ = auVar76._0_4_ + auVar84._0_4_;
      auVar138._4_4_ = auVar76._4_4_ + auVar84._4_4_;
      auVar138._8_4_ = auVar76._8_4_ + auVar84._8_4_;
      auVar138._12_4_ = auVar76._12_4_ + auVar84._12_4_;
      auVar25._8_4_ = 0x3f000000;
      auVar25._0_8_ = 0x3f0000003f000000;
      auVar25._12_4_ = 0x3f000000;
      auVar81 = vmulps_avx512vl(auVar138,auVar25);
      auVar63 = vshufps_avx(auVar81,auVar81,0x54);
      uVar132 = auVar81._0_4_;
      auVar145._4_4_ = uVar132;
      auVar145._0_4_ = uVar132;
      auVar145._8_4_ = uVar132;
      auVar145._12_4_ = uVar132;
      auVar69 = vfmadd213ps_fma(local_450,auVar145,auVar62);
      auVar85 = vfmadd213ps_fma(local_460,auVar145,auVar74);
      auVar89 = vfmadd213ps_fma(local_470,auVar145,auVar72);
      auVar66 = vsubps_avx(auVar85,auVar69);
      auVar69 = vfmadd213ps_fma(auVar66,auVar145,auVar69);
      auVar66 = vsubps_avx(auVar89,auVar85);
      auVar66 = vfmadd213ps_fma(auVar66,auVar145,auVar85);
      auVar66 = vsubps_avx(auVar66,auVar69);
      auVar69 = vfmadd231ps_fma(auVar69,auVar66,auVar145);
      auVar79 = vmulps_avx512vl(auVar66,auVar83);
      auVar251._8_8_ = auVar69._0_8_;
      auVar251._0_8_ = auVar69._0_8_;
      auVar66 = vshufpd_avx(auVar69,auVar69,3);
      auVar69 = vshufps_avx(auVar81,auVar81,0x55);
      auVar85 = vsubps_avx(auVar66,auVar251);
      auVar89 = vfmadd231ps_fma(auVar251,auVar69,auVar85);
      auVar262._8_8_ = auVar79._0_8_;
      auVar262._0_8_ = auVar79._0_8_;
      auVar66 = vshufpd_avx(auVar79,auVar79,3);
      auVar66 = vsubps_avx512vl(auVar66,auVar262);
      auVar66 = vfmadd213ps_avx512vl(auVar66,auVar69,auVar262);
      auVar69 = vxorps_avx512vl(auVar85,auVar272._0_16_);
      auVar79 = vmovshdup_avx512vl(auVar66);
      auVar82 = vxorps_avx512vl(auVar79,auVar272._0_16_);
      auVar83 = vmovshdup_avx512vl(auVar85);
      auVar82 = vpermt2ps_avx512vl(auVar82,ZEXT416(5),auVar85);
      auVar271 = ZEXT464(0x40400000);
      auVar85 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar79._0_4_ * auVar85._0_4_)),auVar66,auVar83);
      auVar69 = vpermt2ps_avx512vl(auVar66,SUB6416(ZEXT464(4),0),auVar69);
      auVar174._0_4_ = auVar85._0_4_;
      auVar174._4_4_ = auVar174._0_4_;
      auVar174._8_4_ = auVar174._0_4_;
      auVar174._12_4_ = auVar174._0_4_;
      auVar66 = vdivps_avx(auVar82,auVar174);
      auVar86 = vdivps_avx512vl(auVar69,auVar174);
      fVar235 = auVar89._0_4_;
      auVar69 = vshufps_avx(auVar89,auVar89,0x55);
      auVar252._0_4_ = fVar235 * auVar66._0_4_ + auVar69._0_4_ * auVar86._0_4_;
      auVar252._4_4_ = fVar235 * auVar66._4_4_ + auVar69._4_4_ * auVar86._4_4_;
      auVar252._8_4_ = fVar235 * auVar66._8_4_ + auVar69._8_4_ * auVar86._8_4_;
      auVar252._12_4_ = fVar235 * auVar66._12_4_ + auVar69._12_4_ * auVar86._12_4_;
      auVar83 = vsubps_avx(auVar63,auVar252);
      auVar69 = vmovshdup_avx(auVar66);
      auVar63 = vinsertps_avx(auVar215,auVar240,0x1c);
      auVar263._0_4_ = auVar69._0_4_ * auVar63._0_4_;
      auVar263._4_4_ = auVar69._4_4_ * auVar63._4_4_;
      auVar263._8_4_ = auVar69._8_4_ * auVar63._8_4_;
      auVar263._12_4_ = auVar69._12_4_ * auVar63._12_4_;
      auVar88 = vinsertps_avx512f(auVar201,auVar228,0x1c);
      auVar69 = vmulps_avx512vl(auVar69,auVar88);
      auVar82 = vminps_avx512vl(auVar263,auVar69);
      auVar89 = vmaxps_avx(auVar69,auVar263);
      auVar79 = vmovshdup_avx(auVar86);
      auVar69 = vinsertps_avx(auVar240,auVar215,0x4c);
      auVar241._0_4_ = auVar79._0_4_ * auVar69._0_4_;
      auVar241._4_4_ = auVar79._4_4_ * auVar69._4_4_;
      auVar241._8_4_ = auVar79._8_4_ * auVar69._8_4_;
      auVar241._12_4_ = auVar79._12_4_ * auVar69._12_4_;
      auVar85 = vinsertps_avx(auVar228,auVar201,0x4c);
      auVar229._0_4_ = auVar79._0_4_ * auVar85._0_4_;
      auVar229._4_4_ = auVar79._4_4_ * auVar85._4_4_;
      auVar229._8_4_ = auVar79._8_4_ * auVar85._8_4_;
      auVar229._12_4_ = auVar79._12_4_ * auVar85._12_4_;
      auVar79 = vminps_avx(auVar241,auVar229);
      auVar82 = vaddps_avx512vl(auVar82,auVar79);
      auVar79 = vmaxps_avx(auVar229,auVar241);
      auVar230._0_4_ = auVar89._0_4_ + auVar79._0_4_;
      auVar230._4_4_ = auVar89._4_4_ + auVar79._4_4_;
      auVar230._8_4_ = auVar89._8_4_ + auVar79._8_4_;
      auVar230._12_4_ = auVar89._12_4_ + auVar79._12_4_;
      auVar242._8_8_ = 0x3f80000000000000;
      auVar242._0_8_ = 0x3f80000000000000;
      auVar89 = vsubps_avx(auVar242,auVar230);
      auVar79 = vsubps_avx(auVar242,auVar82);
      auVar82 = vsubps_avx(auVar76,auVar81);
      auVar81 = vsubps_avx(auVar84,auVar81);
      fVar236 = auVar82._0_4_;
      auVar264._0_4_ = fVar236 * auVar89._0_4_;
      fVar246 = auVar82._4_4_;
      auVar264._4_4_ = fVar246 * auVar89._4_4_;
      fVar247 = auVar82._8_4_;
      auVar264._8_4_ = fVar247 * auVar89._8_4_;
      fVar248 = auVar82._12_4_;
      auVar264._12_4_ = fVar248 * auVar89._12_4_;
      auVar87 = vbroadcastss_avx512vl(auVar66);
      auVar63 = vmulps_avx512vl(auVar87,auVar63);
      auVar88 = vmulps_avx512vl(auVar87,auVar88);
      auVar87 = vminps_avx512vl(auVar63,auVar88);
      auVar88 = vmaxps_avx512vl(auVar88,auVar63);
      auVar63 = vbroadcastss_avx512vl(auVar86);
      auVar69 = vmulps_avx512vl(auVar63,auVar69);
      auVar63 = vmulps_avx512vl(auVar63,auVar85);
      auVar85 = vminps_avx512vl(auVar69,auVar63);
      auVar85 = vaddps_avx512vl(auVar87,auVar85);
      auVar82 = vmulps_avx512vl(auVar82,auVar79);
      fVar235 = auVar81._0_4_;
      auVar231._0_4_ = fVar235 * auVar89._0_4_;
      fVar224 = auVar81._4_4_;
      auVar231._4_4_ = fVar224 * auVar89._4_4_;
      fVar233 = auVar81._8_4_;
      auVar231._8_4_ = fVar233 * auVar89._8_4_;
      fVar234 = auVar81._12_4_;
      auVar231._12_4_ = fVar234 * auVar89._12_4_;
      auVar243._0_4_ = fVar235 * auVar79._0_4_;
      auVar243._4_4_ = fVar224 * auVar79._4_4_;
      auVar243._8_4_ = fVar233 * auVar79._8_4_;
      auVar243._12_4_ = fVar234 * auVar79._12_4_;
      auVar63 = vmaxps_avx(auVar63,auVar69);
      auVar202._0_4_ = auVar88._0_4_ + auVar63._0_4_;
      auVar202._4_4_ = auVar88._4_4_ + auVar63._4_4_;
      auVar202._8_4_ = auVar88._8_4_ + auVar63._8_4_;
      auVar202._12_4_ = auVar88._12_4_ + auVar63._12_4_;
      auVar216._8_8_ = 0x3f800000;
      auVar216._0_8_ = 0x3f800000;
      auVar63 = vsubps_avx(auVar216,auVar202);
      auVar69 = vsubps_avx512vl(auVar216,auVar85);
      auVar260._0_4_ = fVar236 * auVar63._0_4_;
      auVar260._4_4_ = fVar246 * auVar63._4_4_;
      auVar260._8_4_ = fVar247 * auVar63._8_4_;
      auVar260._12_4_ = fVar248 * auVar63._12_4_;
      auVar253._0_4_ = fVar236 * auVar69._0_4_;
      auVar253._4_4_ = fVar246 * auVar69._4_4_;
      auVar253._8_4_ = fVar247 * auVar69._8_4_;
      auVar253._12_4_ = fVar248 * auVar69._12_4_;
      auVar203._0_4_ = fVar235 * auVar63._0_4_;
      auVar203._4_4_ = fVar224 * auVar63._4_4_;
      auVar203._8_4_ = fVar233 * auVar63._8_4_;
      auVar203._12_4_ = fVar234 * auVar63._12_4_;
      auVar217._0_4_ = fVar235 * auVar69._0_4_;
      auVar217._4_4_ = fVar224 * auVar69._4_4_;
      auVar217._8_4_ = fVar233 * auVar69._8_4_;
      auVar217._12_4_ = fVar234 * auVar69._12_4_;
      auVar63 = vminps_avx(auVar260,auVar253);
      auVar69 = vminps_avx512vl(auVar203,auVar217);
      auVar85 = vminps_avx512vl(auVar63,auVar69);
      auVar63 = vmaxps_avx(auVar253,auVar260);
      auVar69 = vmaxps_avx(auVar217,auVar203);
      auVar69 = vmaxps_avx(auVar69,auVar63);
      auVar89 = vminps_avx512vl(auVar264,auVar82);
      auVar63 = vminps_avx(auVar231,auVar243);
      auVar63 = vminps_avx(auVar89,auVar63);
      auVar63 = vhaddps_avx(auVar85,auVar63);
      auVar123._0_16_ = vmaxps_avx512vl(auVar82,auVar264);
      auVar85 = vmaxps_avx(auVar243,auVar231);
      auVar85 = vmaxps_avx(auVar85,auVar123._0_16_);
      auVar69 = vhaddps_avx(auVar69,auVar85);
      auVar63 = vshufps_avx(auVar63,auVar63,0xe8);
      auVar69 = vshufps_avx(auVar69,auVar69,0xe8);
      auVar204._0_4_ = auVar63._0_4_ + auVar83._0_4_;
      auVar204._4_4_ = auVar63._4_4_ + auVar83._4_4_;
      auVar204._8_4_ = auVar63._8_4_ + auVar83._8_4_;
      auVar204._12_4_ = auVar63._12_4_ + auVar83._12_4_;
      auVar218._0_4_ = auVar69._0_4_ + auVar83._0_4_;
      auVar218._4_4_ = auVar69._4_4_ + auVar83._4_4_;
      auVar218._8_4_ = auVar69._8_4_ + auVar83._8_4_;
      auVar218._12_4_ = auVar69._12_4_ + auVar83._12_4_;
      auVar63 = vmaxps_avx(auVar76,auVar204);
      auVar69 = vminps_avx(auVar218,auVar84);
      uVar54 = vcmpps_avx512vl(auVar69,auVar63,1);
    } while ((uVar54 & 3) != 0);
    uVar54 = vcmpps_avx512vl(auVar218,auVar84,1);
    uVar21 = vcmpps_avx512vl(auVar60,auVar204,1);
    if (((ushort)uVar21 & (ushort)uVar54 & 1) == 0) {
      bVar46 = 0;
    }
    else {
      auVar63 = vmovshdup_avx(auVar204);
      bVar46 = auVar77._0_4_ < auVar63._0_4_ & (byte)(uVar54 >> 1) & 0x7f;
    }
    if (((!bVar55 || uVar5 != 0 && !bVar57) | bVar46) == 1) {
      lVar50 = 0xc9;
      do {
        lVar50 = lVar50 + -1;
        if (lVar50 == 0) goto LAB_01819c23;
        auVar60 = vsubss_avx512f(auVar70,auVar83);
        fVar233 = auVar60._0_4_;
        fVar235 = fVar233 * fVar233 * fVar233;
        auVar60 = vmulss_avx512f(auVar83,ZEXT416(0x40400000));
        fVar224 = auVar60._0_4_ * fVar233 * fVar233;
        fVar234 = auVar83._0_4_;
        auVar60 = vmulss_avx512f(ZEXT416((uint)(fVar234 * fVar234)),ZEXT416(0x40400000));
        fVar233 = fVar233 * auVar60._0_4_;
        auVar162._4_4_ = fVar235;
        auVar162._0_4_ = fVar235;
        auVar162._8_4_ = fVar235;
        auVar162._12_4_ = fVar235;
        auVar157._4_4_ = fVar224;
        auVar157._0_4_ = fVar224;
        auVar157._8_4_ = fVar224;
        auVar157._12_4_ = fVar224;
        auVar128._4_4_ = fVar233;
        auVar128._0_4_ = fVar233;
        auVar128._8_4_ = fVar233;
        auVar128._12_4_ = fVar233;
        fVar234 = fVar234 * fVar234 * fVar234;
        auVar187._0_4_ = (float)local_480._0_4_ * fVar234;
        auVar187._4_4_ = (float)local_480._4_4_ * fVar234;
        auVar187._8_4_ = fStack_478 * fVar234;
        auVar187._12_4_ = fStack_474 * fVar234;
        auVar60 = vfmadd231ps_fma(auVar187,auVar72,auVar128);
        auVar60 = vfmadd231ps_fma(auVar60,auVar74,auVar157);
        auVar60 = vfmadd231ps_fma(auVar60,auVar62,auVar162);
        auVar129._8_8_ = auVar60._0_8_;
        auVar129._0_8_ = auVar60._0_8_;
        auVar60 = vshufpd_avx(auVar60,auVar60,3);
        auVar63 = vshufps_avx(auVar83,auVar83,0x55);
        auVar60 = vsubps_avx(auVar60,auVar129);
        auVar63 = vfmadd213ps_fma(auVar60,auVar63,auVar129);
        fVar235 = auVar63._0_4_;
        auVar60 = vshufps_avx(auVar63,auVar63,0x55);
        auVar130._0_4_ = auVar66._0_4_ * fVar235 + auVar86._0_4_ * auVar60._0_4_;
        auVar130._4_4_ = auVar66._4_4_ * fVar235 + auVar86._4_4_ * auVar60._4_4_;
        auVar130._8_4_ = auVar66._8_4_ * fVar235 + auVar86._8_4_ * auVar60._8_4_;
        auVar130._12_4_ = auVar66._12_4_ * fVar235 + auVar86._12_4_ * auVar60._12_4_;
        auVar83 = vsubps_avx(auVar83,auVar130);
        auVar60 = vandps_avx512vl(auVar63,auVar269._0_16_);
        auVar123._0_16_ = vprolq_avx512vl(auVar60,0x20);
        auVar60 = vmaxss_avx(auVar123._0_16_,auVar60);
        bVar57 = auVar60._0_4_ <= (float)local_490._0_4_;
      } while ((float)local_490._0_4_ <= auVar60._0_4_);
      auVar60 = vucomiss_avx512f(auVar80);
      if (bVar57) {
        auVar66 = vucomiss_avx512f(auVar60);
        auVar131 = ZEXT1664(auVar66);
        if (bVar57) {
          vmovshdup_avx(auVar60);
          auVar66 = vucomiss_avx512f(auVar80);
          if (bVar57) {
            auVar63 = vucomiss_avx512f(auVar66);
            auVar131 = ZEXT1664(auVar63);
            if (bVar57) {
              auVar69 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                      ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
              auVar82 = vinsertps_avx(auVar69,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),
                                      0x28);
              auVar69 = vdpps_avx(auVar82,local_4a0,0x7f);
              auVar70 = vdpps_avx(auVar82,local_4b0,0x7f);
              auVar76 = vdpps_avx(auVar82,local_4c0,0x7f);
              auVar85 = vdpps_avx(auVar82,local_4d0,0x7f);
              auVar89 = vdpps_avx(auVar82,local_4e0,0x7f);
              auVar79 = vdpps_avx(auVar82,local_4f0,0x7f);
              auVar80 = vdpps_avx(auVar82,local_500,0x7f);
              auVar82 = vdpps_avx(auVar82,local_510,0x7f);
              auVar81 = vsubss_avx512f(auVar63,auVar66);
              fVar236 = auVar66._0_4_;
              auVar66 = vfmadd231ss_fma(ZEXT416((uint)(fVar236 * auVar89._0_4_)),auVar81,auVar69);
              auVar69 = vfmadd231ss_fma(ZEXT416((uint)(auVar79._0_4_ * fVar236)),auVar81,auVar70);
              auVar70 = vfmadd231ss_fma(ZEXT416((uint)(auVar80._0_4_ * fVar236)),auVar81,auVar76);
              auVar76 = vfmadd231ss_fma(ZEXT416((uint)(fVar236 * auVar82._0_4_)),auVar81,auVar85);
              auVar63 = vsubss_avx512f(auVar63,auVar60);
              auVar195._0_4_ = auVar63._0_4_;
              fVar224 = auVar195._0_4_ * auVar195._0_4_ * auVar195._0_4_;
              auVar63 = vmulss_avx512f(auVar60,ZEXT416(0x40400000));
              fVar233 = auVar63._0_4_ * auVar195._0_4_ * auVar195._0_4_;
              fVar235 = auVar60._0_4_;
              auVar188._0_4_ = fVar235 * fVar235;
              auVar188._4_4_ = auVar60._4_4_ * auVar60._4_4_;
              auVar188._8_4_ = auVar60._8_4_ * auVar60._8_4_;
              auVar188._12_4_ = auVar60._12_4_ * auVar60._12_4_;
              auVar123._0_16_ = vmulss_avx512f(auVar188,ZEXT416(0x40400000));
              fVar234 = auVar195._0_4_ * auVar123._0_4_;
              fVar247 = fVar235 * auVar188._0_4_;
              auVar63 = vfmadd231ss_fma(ZEXT416((uint)(fVar247 * auVar76._0_4_)),
                                        ZEXT416((uint)fVar234),auVar70);
              auVar63 = vfmadd231ss_fma(auVar63,ZEXT416((uint)fVar233),auVar69);
              auVar66 = vfmadd231ss_fma(auVar63,ZEXT416((uint)fVar224),auVar66);
              fVar246 = auVar66._0_4_;
              if ((fVar125 <= fVar246) &&
                 (fVar248 = *(float *)(ray + k * 4 + 0x200), fVar246 <= fVar248)) {
                auVar66 = vshufps_avx(auVar60,auVar60,0x55);
                auVar69 = vsubps_avx512vl(auVar68,auVar66);
                fVar249 = auVar66._0_4_;
                auVar222._0_4_ = fVar249 * (float)local_530._0_4_;
                fVar254 = auVar66._4_4_;
                auVar222._4_4_ = fVar254 * (float)local_530._4_4_;
                fVar255 = auVar66._8_4_;
                auVar222._8_4_ = fVar255 * fStack_528;
                fVar256 = auVar66._12_4_;
                auVar222._12_4_ = fVar256 * fStack_524;
                auVar232._0_4_ = fVar249 * (float)local_580._0_4_;
                auVar232._4_4_ = fVar254 * (float)local_580._4_4_;
                auVar232._8_4_ = fVar255 * fStack_578;
                auVar232._12_4_ = fVar256 * fStack_574;
                auVar244._0_4_ = fVar249 * (float)local_590._0_4_;
                auVar244._4_4_ = fVar254 * (float)local_590._4_4_;
                auVar244._8_4_ = fVar255 * fStack_588;
                auVar244._12_4_ = fVar256 * fStack_584;
                auVar205._0_4_ = fVar249 * (float)local_550._0_4_;
                auVar205._4_4_ = fVar254 * (float)local_550._4_4_;
                auVar205._8_4_ = fVar255 * fStack_548;
                auVar205._12_4_ = fVar256 * fStack_544;
                auVar66 = vfmadd231ps_fma(auVar222,auVar69,local_520);
                auVar63 = vfmadd231ps_fma(auVar232,auVar69,local_560);
                auVar68 = vfmadd231ps_fma(auVar244,auVar69,local_570);
                auVar69 = vfmadd231ps_fma(auVar205,auVar69,local_540);
                auVar66 = vsubps_avx(auVar63,auVar66);
                auVar63 = vsubps_avx(auVar68,auVar63);
                auVar68 = vsubps_avx(auVar69,auVar68);
                auVar245._0_4_ = fVar235 * auVar63._0_4_;
                auVar245._4_4_ = fVar235 * auVar63._4_4_;
                auVar245._8_4_ = fVar235 * auVar63._8_4_;
                auVar245._12_4_ = fVar235 * auVar63._12_4_;
                auVar195._4_4_ = auVar195._0_4_;
                auVar195._8_4_ = auVar195._0_4_;
                auVar195._12_4_ = auVar195._0_4_;
                auVar66 = vfmadd231ps_fma(auVar245,auVar195,auVar66);
                auVar206._0_4_ = fVar235 * auVar68._0_4_;
                auVar206._4_4_ = fVar235 * auVar68._4_4_;
                auVar206._8_4_ = fVar235 * auVar68._8_4_;
                auVar206._12_4_ = fVar235 * auVar68._12_4_;
                auVar63 = vfmadd231ps_fma(auVar206,auVar195,auVar63);
                auVar207._0_4_ = fVar235 * auVar63._0_4_;
                auVar207._4_4_ = fVar235 * auVar63._4_4_;
                auVar207._8_4_ = fVar235 * auVar63._8_4_;
                auVar207._12_4_ = fVar235 * auVar63._12_4_;
                auVar66 = vfmadd231ps_fma(auVar207,auVar195,auVar66);
                auVar26._8_4_ = 0x40400000;
                auVar26._0_8_ = 0x4040000040400000;
                auVar26._12_4_ = 0x40400000;
                auVar123._0_16_ = vmulps_avx512vl(auVar66,auVar26);
                pGVar6 = (context->scene->geometries).items[uVar3].ptr;
                if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                  auVar189._0_4_ = fVar247 * (float)local_5d0._0_4_;
                  auVar189._4_4_ = fVar247 * (float)local_5d0._4_4_;
                  auVar189._8_4_ = fVar247 * fStack_5c8;
                  auVar189._12_4_ = fVar247 * fStack_5c4;
                  auVar175._4_4_ = fVar234;
                  auVar175._0_4_ = fVar234;
                  auVar175._8_4_ = fVar234;
                  auVar175._12_4_ = fVar234;
                  auVar66 = vfmadd132ps_fma(auVar175,auVar189,local_5c0);
                  auVar163._4_4_ = fVar233;
                  auVar163._0_4_ = fVar233;
                  auVar163._8_4_ = fVar233;
                  auVar163._12_4_ = fVar233;
                  auVar66 = vfmadd132ps_fma(auVar163,auVar66,local_5b0);
                  auVar158._4_4_ = fVar224;
                  auVar158._0_4_ = fVar224;
                  auVar158._8_4_ = fVar224;
                  auVar158._12_4_ = fVar224;
                  auVar68 = vfmadd132ps_fma(auVar158,auVar66,local_5a0);
                  auVar66 = vshufps_avx(auVar68,auVar68,0xc9);
                  auVar63 = vshufps_avx(auVar123._0_16_,auVar123._0_16_,0xc9);
                  auVar159._0_4_ = auVar68._0_4_ * auVar63._0_4_;
                  auVar159._4_4_ = auVar68._4_4_ * auVar63._4_4_;
                  auVar159._8_4_ = auVar68._8_4_ * auVar63._8_4_;
                  auVar159._12_4_ = auVar68._12_4_ * auVar63._12_4_;
                  auVar66 = vfmsub231ps_fma(auVar159,auVar123._0_16_,auVar66);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x200) = fVar246;
                    uVar132 = vextractps_avx(auVar66,1);
                    *(undefined4 *)(ray + k * 4 + 0x300) = uVar132;
                    uVar132 = vextractps_avx(auVar66,2);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar132;
                    *(int *)(ray + k * 4 + 0x380) = auVar66._0_4_;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar235;
                    *(float *)(ray + k * 4 + 0x400) = fVar236;
                    *(uint *)(ray + k * 4 + 0x440) = uVar4;
                    *(uint *)(ray + k * 4 + 0x480) = uVar3;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                    goto LAB_01819c23;
                  }
                  local_200 = vbroadcastss_avx512f(auVar60);
                  auVar111 = vbroadcastss_avx512f(ZEXT416(1));
                  local_1c0 = vpermps_avx512f(auVar111,ZEXT1664(auVar60));
                  auVar111 = vpermps_avx512f(auVar111,ZEXT1664(auVar66));
                  auVar123 = vbroadcastss_avx512f(ZEXT416(2));
                  local_280 = vpermps_avx512f(auVar123,ZEXT1664(auVar66));
                  local_240 = vbroadcastss_avx512f(auVar66);
                  local_2c0[0] = (RTCHitN)auVar111[0];
                  local_2c0[1] = (RTCHitN)auVar111[1];
                  local_2c0[2] = (RTCHitN)auVar111[2];
                  local_2c0[3] = (RTCHitN)auVar111[3];
                  local_2c0[4] = (RTCHitN)auVar111[4];
                  local_2c0[5] = (RTCHitN)auVar111[5];
                  local_2c0[6] = (RTCHitN)auVar111[6];
                  local_2c0[7] = (RTCHitN)auVar111[7];
                  local_2c0[8] = (RTCHitN)auVar111[8];
                  local_2c0[9] = (RTCHitN)auVar111[9];
                  local_2c0[10] = (RTCHitN)auVar111[10];
                  local_2c0[0xb] = (RTCHitN)auVar111[0xb];
                  local_2c0[0xc] = (RTCHitN)auVar111[0xc];
                  local_2c0[0xd] = (RTCHitN)auVar111[0xd];
                  local_2c0[0xe] = (RTCHitN)auVar111[0xe];
                  local_2c0[0xf] = (RTCHitN)auVar111[0xf];
                  local_2c0[0x10] = (RTCHitN)auVar111[0x10];
                  local_2c0[0x11] = (RTCHitN)auVar111[0x11];
                  local_2c0[0x12] = (RTCHitN)auVar111[0x12];
                  local_2c0[0x13] = (RTCHitN)auVar111[0x13];
                  local_2c0[0x14] = (RTCHitN)auVar111[0x14];
                  local_2c0[0x15] = (RTCHitN)auVar111[0x15];
                  local_2c0[0x16] = (RTCHitN)auVar111[0x16];
                  local_2c0[0x17] = (RTCHitN)auVar111[0x17];
                  local_2c0[0x18] = (RTCHitN)auVar111[0x18];
                  local_2c0[0x19] = (RTCHitN)auVar111[0x19];
                  local_2c0[0x1a] = (RTCHitN)auVar111[0x1a];
                  local_2c0[0x1b] = (RTCHitN)auVar111[0x1b];
                  local_2c0[0x1c] = (RTCHitN)auVar111[0x1c];
                  local_2c0[0x1d] = (RTCHitN)auVar111[0x1d];
                  local_2c0[0x1e] = (RTCHitN)auVar111[0x1e];
                  local_2c0[0x1f] = (RTCHitN)auVar111[0x1f];
                  local_2c0[0x20] = (RTCHitN)auVar111[0x20];
                  local_2c0[0x21] = (RTCHitN)auVar111[0x21];
                  local_2c0[0x22] = (RTCHitN)auVar111[0x22];
                  local_2c0[0x23] = (RTCHitN)auVar111[0x23];
                  local_2c0[0x24] = (RTCHitN)auVar111[0x24];
                  local_2c0[0x25] = (RTCHitN)auVar111[0x25];
                  local_2c0[0x26] = (RTCHitN)auVar111[0x26];
                  local_2c0[0x27] = (RTCHitN)auVar111[0x27];
                  local_2c0[0x28] = (RTCHitN)auVar111[0x28];
                  local_2c0[0x29] = (RTCHitN)auVar111[0x29];
                  local_2c0[0x2a] = (RTCHitN)auVar111[0x2a];
                  local_2c0[0x2b] = (RTCHitN)auVar111[0x2b];
                  local_2c0[0x2c] = (RTCHitN)auVar111[0x2c];
                  local_2c0[0x2d] = (RTCHitN)auVar111[0x2d];
                  local_2c0[0x2e] = (RTCHitN)auVar111[0x2e];
                  local_2c0[0x2f] = (RTCHitN)auVar111[0x2f];
                  local_2c0[0x30] = (RTCHitN)auVar111[0x30];
                  local_2c0[0x31] = (RTCHitN)auVar111[0x31];
                  local_2c0[0x32] = (RTCHitN)auVar111[0x32];
                  local_2c0[0x33] = (RTCHitN)auVar111[0x33];
                  local_2c0[0x34] = (RTCHitN)auVar111[0x34];
                  local_2c0[0x35] = (RTCHitN)auVar111[0x35];
                  local_2c0[0x36] = (RTCHitN)auVar111[0x36];
                  local_2c0[0x37] = (RTCHitN)auVar111[0x37];
                  local_2c0[0x38] = (RTCHitN)auVar111[0x38];
                  local_2c0[0x39] = (RTCHitN)auVar111[0x39];
                  local_2c0[0x3a] = (RTCHitN)auVar111[0x3a];
                  local_2c0[0x3b] = (RTCHitN)auVar111[0x3b];
                  local_2c0[0x3c] = (RTCHitN)auVar111[0x3c];
                  local_2c0[0x3d] = (RTCHitN)auVar111[0x3d];
                  local_2c0[0x3e] = (RTCHitN)auVar111[0x3e];
                  local_2c0[0x3f] = (RTCHitN)auVar111[0x3f];
                  local_180 = local_340._0_8_;
                  uStack_178 = local_340._8_8_;
                  uStack_170 = local_340._16_8_;
                  uStack_168 = local_340._24_8_;
                  uStack_160 = local_340._32_8_;
                  uStack_158 = local_340._40_8_;
                  uStack_150 = local_340._48_8_;
                  uStack_148 = local_340._56_8_;
                  auVar111 = vmovdqa64_avx512f(local_300);
                  local_140 = vmovdqa64_avx512f(auVar111);
                  vpcmpeqd_avx2(auVar111._0_32_,auVar111._0_32_);
                  local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                  local_c0 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                  *(float *)(ray + k * 4 + 0x200) = fVar246;
                  auVar123 = vmovdqa64_avx512f(local_380);
                  local_400 = vmovdqa64_avx512f(auVar123);
                  local_620.valid = (int *)local_400;
                  local_620.geometryUserPtr = pGVar6->userPtr;
                  local_620.context = context->user;
                  local_620.hit = local_2c0;
                  local_620.N = 0x10;
                  local_620.ray = (RTCRayN *)ray;
                  if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar6->intersectionFilterN)(&local_620);
                    auVar131 = ZEXT464(0x3f800000);
                    auVar268 = ZEXT3264(_DAT_01fb9fe0);
                    auVar60 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                    auVar267 = ZEXT1664(auVar60);
                    auVar111._32_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                    auVar266 = ZEXT3264(auVar111._32_32_);
                    auVar60 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                    auVar272 = ZEXT1664(auVar60);
                    auVar60 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar270 = ZEXT1664(auVar60);
                    auVar60 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar269 = ZEXT1664(auVar60);
                    auVar123 = vmovdqa64_avx512f(local_400);
                  }
                  uVar21 = vptestmd_avx512f(auVar123,auVar123);
                  if ((short)uVar21 != 0) {
                    p_Var7 = context->args->filter;
                    if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var7)(&local_620);
                      auVar131 = ZEXT464(0x3f800000);
                      auVar268 = ZEXT3264(_DAT_01fb9fe0);
                      auVar60 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                      auVar267 = ZEXT1664(auVar60);
                      auVar111._32_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar266 = ZEXT3264(auVar111._32_32_);
                      auVar60 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                      auVar272 = ZEXT1664(auVar60);
                      auVar60 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar270 = ZEXT1664(auVar60);
                      auVar60 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar269 = ZEXT1664(auVar60);
                      auVar123 = vmovdqa64_avx512f(local_400);
                    }
                    uVar54 = vptestmd_avx512f(auVar123,auVar123);
                    if ((short)uVar54 != 0) {
                      iVar31 = *(int *)(local_620.hit + 4);
                      iVar32 = *(int *)(local_620.hit + 8);
                      iVar33 = *(int *)(local_620.hit + 0xc);
                      iVar34 = *(int *)(local_620.hit + 0x10);
                      iVar35 = *(int *)(local_620.hit + 0x14);
                      iVar36 = *(int *)(local_620.hit + 0x18);
                      iVar37 = *(int *)(local_620.hit + 0x1c);
                      iVar38 = *(int *)(local_620.hit + 0x20);
                      iVar39 = *(int *)(local_620.hit + 0x24);
                      iVar40 = *(int *)(local_620.hit + 0x28);
                      iVar41 = *(int *)(local_620.hit + 0x2c);
                      iVar42 = *(int *)(local_620.hit + 0x30);
                      iVar43 = *(int *)(local_620.hit + 0x34);
                      iVar44 = *(int *)(local_620.hit + 0x38);
                      iVar45 = *(int *)(local_620.hit + 0x3c);
                      bVar46 = (byte)uVar54;
                      bVar57 = (bool)((byte)(uVar54 >> 1) & 1);
                      bVar56 = (bool)((byte)(uVar54 >> 2) & 1);
                      bVar55 = (bool)((byte)(uVar54 >> 3) & 1);
                      bVar58 = (bool)((byte)(uVar54 >> 4) & 1);
                      bVar59 = (bool)((byte)(uVar54 >> 5) & 1);
                      bVar10 = (bool)((byte)(uVar54 >> 6) & 1);
                      bVar11 = (bool)((byte)(uVar54 >> 7) & 1);
                      bVar12 = (byte)(uVar54 >> 8);
                      bVar13 = (bool)((byte)(uVar54 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar54 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar54 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar54 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar54 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar54 >> 0xe) & 1);
                      bVar19 = SUB81(uVar54 >> 0xf,0);
                      *(uint *)(local_620.ray + 0x300) =
                           (uint)(bVar46 & 1) * *(int *)local_620.hit |
                           (uint)!(bool)(bVar46 & 1) * *(int *)(local_620.ray + 0x300);
                      *(uint *)(local_620.ray + 0x304) =
                           (uint)bVar57 * iVar31 | (uint)!bVar57 * *(int *)(local_620.ray + 0x304);
                      *(uint *)(local_620.ray + 0x308) =
                           (uint)bVar56 * iVar32 | (uint)!bVar56 * *(int *)(local_620.ray + 0x308);
                      *(uint *)(local_620.ray + 0x30c) =
                           (uint)bVar55 * iVar33 | (uint)!bVar55 * *(int *)(local_620.ray + 0x30c);
                      *(uint *)(local_620.ray + 0x310) =
                           (uint)bVar58 * iVar34 | (uint)!bVar58 * *(int *)(local_620.ray + 0x310);
                      *(uint *)(local_620.ray + 0x314) =
                           (uint)bVar59 * iVar35 | (uint)!bVar59 * *(int *)(local_620.ray + 0x314);
                      *(uint *)(local_620.ray + 0x318) =
                           (uint)bVar10 * iVar36 | (uint)!bVar10 * *(int *)(local_620.ray + 0x318);
                      *(uint *)(local_620.ray + 0x31c) =
                           (uint)bVar11 * iVar37 | (uint)!bVar11 * *(int *)(local_620.ray + 0x31c);
                      *(uint *)(local_620.ray + 800) =
                           (uint)(bVar12 & 1) * iVar38 |
                           (uint)!(bool)(bVar12 & 1) * *(int *)(local_620.ray + 800);
                      *(uint *)(local_620.ray + 0x324) =
                           (uint)bVar13 * iVar39 | (uint)!bVar13 * *(int *)(local_620.ray + 0x324);
                      *(uint *)(local_620.ray + 0x328) =
                           (uint)bVar14 * iVar40 | (uint)!bVar14 * *(int *)(local_620.ray + 0x328);
                      *(uint *)(local_620.ray + 0x32c) =
                           (uint)bVar15 * iVar41 | (uint)!bVar15 * *(int *)(local_620.ray + 0x32c);
                      *(uint *)(local_620.ray + 0x330) =
                           (uint)bVar16 * iVar42 | (uint)!bVar16 * *(int *)(local_620.ray + 0x330);
                      *(uint *)(local_620.ray + 0x334) =
                           (uint)bVar17 * iVar43 | (uint)!bVar17 * *(int *)(local_620.ray + 0x334);
                      *(uint *)(local_620.ray + 0x338) =
                           (uint)bVar18 * iVar44 | (uint)!bVar18 * *(int *)(local_620.ray + 0x338);
                      *(uint *)(local_620.ray + 0x33c) =
                           (uint)bVar19 * iVar45 | (uint)!bVar19 * *(int *)(local_620.ray + 0x33c);
                      iVar31 = *(int *)(local_620.hit + 0x44);
                      iVar32 = *(int *)(local_620.hit + 0x48);
                      iVar33 = *(int *)(local_620.hit + 0x4c);
                      iVar34 = *(int *)(local_620.hit + 0x50);
                      iVar35 = *(int *)(local_620.hit + 0x54);
                      iVar36 = *(int *)(local_620.hit + 0x58);
                      iVar37 = *(int *)(local_620.hit + 0x5c);
                      iVar38 = *(int *)(local_620.hit + 0x60);
                      iVar39 = *(int *)(local_620.hit + 100);
                      iVar40 = *(int *)(local_620.hit + 0x68);
                      iVar41 = *(int *)(local_620.hit + 0x6c);
                      iVar42 = *(int *)(local_620.hit + 0x70);
                      iVar43 = *(int *)(local_620.hit + 0x74);
                      iVar44 = *(int *)(local_620.hit + 0x78);
                      iVar45 = *(int *)(local_620.hit + 0x7c);
                      bVar57 = (bool)((byte)(uVar54 >> 1) & 1);
                      bVar56 = (bool)((byte)(uVar54 >> 2) & 1);
                      bVar55 = (bool)((byte)(uVar54 >> 3) & 1);
                      bVar58 = (bool)((byte)(uVar54 >> 4) & 1);
                      bVar59 = (bool)((byte)(uVar54 >> 5) & 1);
                      bVar10 = (bool)((byte)(uVar54 >> 6) & 1);
                      bVar11 = (bool)((byte)(uVar54 >> 7) & 1);
                      bVar13 = (bool)((byte)(uVar54 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar54 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar54 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar54 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar54 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar54 >> 0xe) & 1);
                      bVar19 = SUB81(uVar54 >> 0xf,0);
                      *(uint *)(local_620.ray + 0x340) =
                           (uint)(bVar46 & 1) * *(int *)(local_620.hit + 0x40) |
                           (uint)!(bool)(bVar46 & 1) * *(int *)(local_620.ray + 0x340);
                      *(uint *)(local_620.ray + 0x344) =
                           (uint)bVar57 * iVar31 | (uint)!bVar57 * *(int *)(local_620.ray + 0x344);
                      *(uint *)(local_620.ray + 0x348) =
                           (uint)bVar56 * iVar32 | (uint)!bVar56 * *(int *)(local_620.ray + 0x348);
                      *(uint *)(local_620.ray + 0x34c) =
                           (uint)bVar55 * iVar33 | (uint)!bVar55 * *(int *)(local_620.ray + 0x34c);
                      *(uint *)(local_620.ray + 0x350) =
                           (uint)bVar58 * iVar34 | (uint)!bVar58 * *(int *)(local_620.ray + 0x350);
                      *(uint *)(local_620.ray + 0x354) =
                           (uint)bVar59 * iVar35 | (uint)!bVar59 * *(int *)(local_620.ray + 0x354);
                      *(uint *)(local_620.ray + 0x358) =
                           (uint)bVar10 * iVar36 | (uint)!bVar10 * *(int *)(local_620.ray + 0x358);
                      *(uint *)(local_620.ray + 0x35c) =
                           (uint)bVar11 * iVar37 | (uint)!bVar11 * *(int *)(local_620.ray + 0x35c);
                      *(uint *)(local_620.ray + 0x360) =
                           (uint)(bVar12 & 1) * iVar38 |
                           (uint)!(bool)(bVar12 & 1) * *(int *)(local_620.ray + 0x360);
                      *(uint *)(local_620.ray + 0x364) =
                           (uint)bVar13 * iVar39 | (uint)!bVar13 * *(int *)(local_620.ray + 0x364);
                      *(uint *)(local_620.ray + 0x368) =
                           (uint)bVar14 * iVar40 | (uint)!bVar14 * *(int *)(local_620.ray + 0x368);
                      *(uint *)(local_620.ray + 0x36c) =
                           (uint)bVar15 * iVar41 | (uint)!bVar15 * *(int *)(local_620.ray + 0x36c);
                      *(uint *)(local_620.ray + 0x370) =
                           (uint)bVar16 * iVar42 | (uint)!bVar16 * *(int *)(local_620.ray + 0x370);
                      *(uint *)(local_620.ray + 0x374) =
                           (uint)bVar17 * iVar43 | (uint)!bVar17 * *(int *)(local_620.ray + 0x374);
                      *(uint *)(local_620.ray + 0x378) =
                           (uint)bVar18 * iVar44 | (uint)!bVar18 * *(int *)(local_620.ray + 0x378);
                      *(uint *)(local_620.ray + 0x37c) =
                           (uint)bVar19 * iVar45 | (uint)!bVar19 * *(int *)(local_620.ray + 0x37c);
                      iVar31 = *(int *)(local_620.hit + 0x84);
                      iVar32 = *(int *)(local_620.hit + 0x88);
                      iVar33 = *(int *)(local_620.hit + 0x8c);
                      iVar34 = *(int *)(local_620.hit + 0x90);
                      iVar35 = *(int *)(local_620.hit + 0x94);
                      iVar36 = *(int *)(local_620.hit + 0x98);
                      iVar37 = *(int *)(local_620.hit + 0x9c);
                      iVar38 = *(int *)(local_620.hit + 0xa0);
                      iVar39 = *(int *)(local_620.hit + 0xa4);
                      iVar40 = *(int *)(local_620.hit + 0xa8);
                      iVar41 = *(int *)(local_620.hit + 0xac);
                      iVar42 = *(int *)(local_620.hit + 0xb0);
                      iVar43 = *(int *)(local_620.hit + 0xb4);
                      iVar44 = *(int *)(local_620.hit + 0xb8);
                      iVar45 = *(int *)(local_620.hit + 0xbc);
                      bVar57 = (bool)((byte)(uVar54 >> 1) & 1);
                      bVar56 = (bool)((byte)(uVar54 >> 2) & 1);
                      bVar55 = (bool)((byte)(uVar54 >> 3) & 1);
                      bVar58 = (bool)((byte)(uVar54 >> 4) & 1);
                      bVar59 = (bool)((byte)(uVar54 >> 5) & 1);
                      bVar10 = (bool)((byte)(uVar54 >> 6) & 1);
                      bVar11 = (bool)((byte)(uVar54 >> 7) & 1);
                      bVar13 = (bool)((byte)(uVar54 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar54 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar54 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar54 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar54 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar54 >> 0xe) & 1);
                      bVar19 = SUB81(uVar54 >> 0xf,0);
                      *(uint *)(local_620.ray + 0x380) =
                           (uint)(bVar46 & 1) * *(int *)(local_620.hit + 0x80) |
                           (uint)!(bool)(bVar46 & 1) * *(int *)(local_620.ray + 0x380);
                      *(uint *)(local_620.ray + 900) =
                           (uint)bVar57 * iVar31 | (uint)!bVar57 * *(int *)(local_620.ray + 900);
                      *(uint *)(local_620.ray + 0x388) =
                           (uint)bVar56 * iVar32 | (uint)!bVar56 * *(int *)(local_620.ray + 0x388);
                      *(uint *)(local_620.ray + 0x38c) =
                           (uint)bVar55 * iVar33 | (uint)!bVar55 * *(int *)(local_620.ray + 0x38c);
                      *(uint *)(local_620.ray + 0x390) =
                           (uint)bVar58 * iVar34 | (uint)!bVar58 * *(int *)(local_620.ray + 0x390);
                      *(uint *)(local_620.ray + 0x394) =
                           (uint)bVar59 * iVar35 | (uint)!bVar59 * *(int *)(local_620.ray + 0x394);
                      *(uint *)(local_620.ray + 0x398) =
                           (uint)bVar10 * iVar36 | (uint)!bVar10 * *(int *)(local_620.ray + 0x398);
                      *(uint *)(local_620.ray + 0x39c) =
                           (uint)bVar11 * iVar37 | (uint)!bVar11 * *(int *)(local_620.ray + 0x39c);
                      *(uint *)(local_620.ray + 0x3a0) =
                           (uint)(bVar12 & 1) * iVar38 |
                           (uint)!(bool)(bVar12 & 1) * *(int *)(local_620.ray + 0x3a0);
                      *(uint *)(local_620.ray + 0x3a4) =
                           (uint)bVar13 * iVar39 | (uint)!bVar13 * *(int *)(local_620.ray + 0x3a4);
                      *(uint *)(local_620.ray + 0x3a8) =
                           (uint)bVar14 * iVar40 | (uint)!bVar14 * *(int *)(local_620.ray + 0x3a8);
                      *(uint *)(local_620.ray + 0x3ac) =
                           (uint)bVar15 * iVar41 | (uint)!bVar15 * *(int *)(local_620.ray + 0x3ac);
                      *(uint *)(local_620.ray + 0x3b0) =
                           (uint)bVar16 * iVar42 | (uint)!bVar16 * *(int *)(local_620.ray + 0x3b0);
                      *(uint *)(local_620.ray + 0x3b4) =
                           (uint)bVar17 * iVar43 | (uint)!bVar17 * *(int *)(local_620.ray + 0x3b4);
                      *(uint *)(local_620.ray + 0x3b8) =
                           (uint)bVar18 * iVar44 | (uint)!bVar18 * *(int *)(local_620.ray + 0x3b8);
                      *(uint *)(local_620.ray + 0x3bc) =
                           (uint)bVar19 * iVar45 | (uint)!bVar19 * *(int *)(local_620.ray + 0x3bc);
                      iVar31 = *(int *)(local_620.hit + 0xc4);
                      iVar32 = *(int *)(local_620.hit + 200);
                      iVar33 = *(int *)(local_620.hit + 0xcc);
                      iVar34 = *(int *)(local_620.hit + 0xd0);
                      iVar35 = *(int *)(local_620.hit + 0xd4);
                      iVar36 = *(int *)(local_620.hit + 0xd8);
                      iVar37 = *(int *)(local_620.hit + 0xdc);
                      iVar38 = *(int *)(local_620.hit + 0xe0);
                      iVar39 = *(int *)(local_620.hit + 0xe4);
                      iVar40 = *(int *)(local_620.hit + 0xe8);
                      iVar41 = *(int *)(local_620.hit + 0xec);
                      iVar42 = *(int *)(local_620.hit + 0xf0);
                      iVar43 = *(int *)(local_620.hit + 0xf4);
                      iVar44 = *(int *)(local_620.hit + 0xf8);
                      iVar45 = *(int *)(local_620.hit + 0xfc);
                      bVar57 = (bool)((byte)(uVar54 >> 1) & 1);
                      bVar56 = (bool)((byte)(uVar54 >> 2) & 1);
                      bVar55 = (bool)((byte)(uVar54 >> 3) & 1);
                      bVar58 = (bool)((byte)(uVar54 >> 4) & 1);
                      bVar59 = (bool)((byte)(uVar54 >> 5) & 1);
                      bVar10 = (bool)((byte)(uVar54 >> 6) & 1);
                      bVar11 = (bool)((byte)(uVar54 >> 7) & 1);
                      bVar13 = (bool)((byte)(uVar54 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar54 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar54 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar54 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar54 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar54 >> 0xe) & 1);
                      bVar19 = SUB81(uVar54 >> 0xf,0);
                      *(uint *)(local_620.ray + 0x3c0) =
                           (uint)(bVar46 & 1) * *(int *)(local_620.hit + 0xc0) |
                           (uint)!(bool)(bVar46 & 1) * *(int *)(local_620.ray + 0x3c0);
                      *(uint *)(local_620.ray + 0x3c4) =
                           (uint)bVar57 * iVar31 | (uint)!bVar57 * *(int *)(local_620.ray + 0x3c4);
                      *(uint *)(local_620.ray + 0x3c8) =
                           (uint)bVar56 * iVar32 | (uint)!bVar56 * *(int *)(local_620.ray + 0x3c8);
                      *(uint *)(local_620.ray + 0x3cc) =
                           (uint)bVar55 * iVar33 | (uint)!bVar55 * *(int *)(local_620.ray + 0x3cc);
                      *(uint *)(local_620.ray + 0x3d0) =
                           (uint)bVar58 * iVar34 | (uint)!bVar58 * *(int *)(local_620.ray + 0x3d0);
                      *(uint *)(local_620.ray + 0x3d4) =
                           (uint)bVar59 * iVar35 | (uint)!bVar59 * *(int *)(local_620.ray + 0x3d4);
                      *(uint *)(local_620.ray + 0x3d8) =
                           (uint)bVar10 * iVar36 | (uint)!bVar10 * *(int *)(local_620.ray + 0x3d8);
                      *(uint *)(local_620.ray + 0x3dc) =
                           (uint)bVar11 * iVar37 | (uint)!bVar11 * *(int *)(local_620.ray + 0x3dc);
                      *(uint *)(local_620.ray + 0x3e0) =
                           (uint)(bVar12 & 1) * iVar38 |
                           (uint)!(bool)(bVar12 & 1) * *(int *)(local_620.ray + 0x3e0);
                      *(uint *)(local_620.ray + 0x3e4) =
                           (uint)bVar13 * iVar39 | (uint)!bVar13 * *(int *)(local_620.ray + 0x3e4);
                      *(uint *)(local_620.ray + 1000) =
                           (uint)bVar14 * iVar40 | (uint)!bVar14 * *(int *)(local_620.ray + 1000);
                      *(uint *)(local_620.ray + 0x3ec) =
                           (uint)bVar15 * iVar41 | (uint)!bVar15 * *(int *)(local_620.ray + 0x3ec);
                      *(uint *)(local_620.ray + 0x3f0) =
                           (uint)bVar16 * iVar42 | (uint)!bVar16 * *(int *)(local_620.ray + 0x3f0);
                      *(uint *)(local_620.ray + 0x3f4) =
                           (uint)bVar17 * iVar43 | (uint)!bVar17 * *(int *)(local_620.ray + 0x3f4);
                      *(uint *)(local_620.ray + 0x3f8) =
                           (uint)bVar18 * iVar44 | (uint)!bVar18 * *(int *)(local_620.ray + 0x3f8);
                      *(uint *)(local_620.ray + 0x3fc) =
                           (uint)bVar19 * iVar45 | (uint)!bVar19 * *(int *)(local_620.ray + 0x3fc);
                      iVar31 = *(int *)(local_620.hit + 0x104);
                      iVar32 = *(int *)(local_620.hit + 0x108);
                      iVar33 = *(int *)(local_620.hit + 0x10c);
                      iVar34 = *(int *)(local_620.hit + 0x110);
                      iVar35 = *(int *)(local_620.hit + 0x114);
                      iVar36 = *(int *)(local_620.hit + 0x118);
                      iVar37 = *(int *)(local_620.hit + 0x11c);
                      iVar38 = *(int *)(local_620.hit + 0x120);
                      iVar39 = *(int *)(local_620.hit + 0x124);
                      iVar40 = *(int *)(local_620.hit + 0x128);
                      iVar41 = *(int *)(local_620.hit + 300);
                      iVar42 = *(int *)(local_620.hit + 0x130);
                      iVar43 = *(int *)(local_620.hit + 0x134);
                      iVar44 = *(int *)(local_620.hit + 0x138);
                      iVar45 = *(int *)(local_620.hit + 0x13c);
                      bVar57 = (bool)((byte)(uVar54 >> 1) & 1);
                      bVar56 = (bool)((byte)(uVar54 >> 2) & 1);
                      bVar55 = (bool)((byte)(uVar54 >> 3) & 1);
                      bVar58 = (bool)((byte)(uVar54 >> 4) & 1);
                      bVar59 = (bool)((byte)(uVar54 >> 5) & 1);
                      bVar10 = (bool)((byte)(uVar54 >> 6) & 1);
                      bVar11 = (bool)((byte)(uVar54 >> 7) & 1);
                      bVar13 = (bool)((byte)(uVar54 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar54 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar54 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar54 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar54 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar54 >> 0xe) & 1);
                      bVar19 = SUB81(uVar54 >> 0xf,0);
                      *(uint *)(local_620.ray + 0x400) =
                           (uint)(bVar46 & 1) * *(int *)(local_620.hit + 0x100) |
                           (uint)!(bool)(bVar46 & 1) * *(int *)(local_620.ray + 0x400);
                      *(uint *)(local_620.ray + 0x404) =
                           (uint)bVar57 * iVar31 | (uint)!bVar57 * *(int *)(local_620.ray + 0x404);
                      *(uint *)(local_620.ray + 0x408) =
                           (uint)bVar56 * iVar32 | (uint)!bVar56 * *(int *)(local_620.ray + 0x408);
                      *(uint *)(local_620.ray + 0x40c) =
                           (uint)bVar55 * iVar33 | (uint)!bVar55 * *(int *)(local_620.ray + 0x40c);
                      *(uint *)(local_620.ray + 0x410) =
                           (uint)bVar58 * iVar34 | (uint)!bVar58 * *(int *)(local_620.ray + 0x410);
                      *(uint *)(local_620.ray + 0x414) =
                           (uint)bVar59 * iVar35 | (uint)!bVar59 * *(int *)(local_620.ray + 0x414);
                      *(uint *)(local_620.ray + 0x418) =
                           (uint)bVar10 * iVar36 | (uint)!bVar10 * *(int *)(local_620.ray + 0x418);
                      *(uint *)(local_620.ray + 0x41c) =
                           (uint)bVar11 * iVar37 | (uint)!bVar11 * *(int *)(local_620.ray + 0x41c);
                      *(uint *)(local_620.ray + 0x420) =
                           (uint)(bVar12 & 1) * iVar38 |
                           (uint)!(bool)(bVar12 & 1) * *(int *)(local_620.ray + 0x420);
                      *(uint *)(local_620.ray + 0x424) =
                           (uint)bVar13 * iVar39 | (uint)!bVar13 * *(int *)(local_620.ray + 0x424);
                      *(uint *)(local_620.ray + 0x428) =
                           (uint)bVar14 * iVar40 | (uint)!bVar14 * *(int *)(local_620.ray + 0x428);
                      *(uint *)(local_620.ray + 0x42c) =
                           (uint)bVar15 * iVar41 | (uint)!bVar15 * *(int *)(local_620.ray + 0x42c);
                      *(uint *)(local_620.ray + 0x430) =
                           (uint)bVar16 * iVar42 | (uint)!bVar16 * *(int *)(local_620.ray + 0x430);
                      *(uint *)(local_620.ray + 0x434) =
                           (uint)bVar17 * iVar43 | (uint)!bVar17 * *(int *)(local_620.ray + 0x434);
                      *(uint *)(local_620.ray + 0x438) =
                           (uint)bVar18 * iVar44 | (uint)!bVar18 * *(int *)(local_620.ray + 0x438);
                      *(uint *)(local_620.ray + 0x43c) =
                           (uint)bVar19 * iVar45 | (uint)!bVar19 * *(int *)(local_620.ray + 0x43c);
                      auVar111 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_620.hit + 0x140));
                      auVar111 = vmovdqu32_avx512f(auVar111);
                      *(undefined1 (*) [64])(local_620.ray + 0x440) = auVar111;
                      auVar111 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_620.hit + 0x180));
                      auVar111 = vmovdqu32_avx512f(auVar111);
                      *(undefined1 (*) [64])(local_620.ray + 0x480) = auVar111;
                      auVar124 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_620.hit + 0x1c0));
                      auVar111 = vmovdqa32_avx512f(auVar124);
                      *(undefined1 (*) [64])(local_620.ray + 0x4c0) = auVar111;
                      auVar111 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_620.hit + 0x200));
                      bVar57 = (bool)((byte)(uVar54 >> 1) & 1);
                      auVar30._4_56_ = auVar111._8_56_;
                      auVar30._0_4_ = (uint)bVar57 * auVar111._4_4_ | (uint)!bVar57 * auVar124._4_4_
                      ;
                      auVar123._0_8_ = auVar30._0_8_ << 0x20;
                      bVar57 = (bool)((byte)(uVar54 >> 2) & 1);
                      auVar123._8_4_ =
                           (uint)bVar57 * auVar111._8_4_ | (uint)!bVar57 * auVar124._8_4_;
                      bVar57 = (bool)((byte)(uVar54 >> 3) & 1);
                      auVar123._12_4_ =
                           (uint)bVar57 * auVar111._12_4_ | (uint)!bVar57 * auVar124._12_4_;
                      bVar57 = (bool)((byte)(uVar54 >> 4) & 1);
                      auVar123._16_4_ =
                           (uint)bVar57 * auVar111._16_4_ | (uint)!bVar57 * auVar124._16_4_;
                      bVar57 = (bool)((byte)(uVar54 >> 5) & 1);
                      auVar123._20_4_ =
                           (uint)bVar57 * auVar111._20_4_ | (uint)!bVar57 * auVar124._20_4_;
                      bVar57 = (bool)((byte)(uVar54 >> 6) & 1);
                      auVar123._24_4_ =
                           (uint)bVar57 * auVar111._24_4_ | (uint)!bVar57 * auVar124._24_4_;
                      bVar57 = (bool)((byte)(uVar54 >> 7) & 1);
                      auVar123._28_4_ =
                           (uint)bVar57 * auVar111._28_4_ | (uint)!bVar57 * auVar124._28_4_;
                      auVar123._32_4_ =
                           (uint)(bVar12 & 1) * auVar111._32_4_ |
                           (uint)!(bool)(bVar12 & 1) * auVar124._32_4_;
                      bVar57 = (bool)((byte)(uVar54 >> 9) & 1);
                      auVar123._36_4_ =
                           (uint)bVar57 * auVar111._36_4_ | (uint)!bVar57 * auVar124._36_4_;
                      bVar57 = (bool)((byte)(uVar54 >> 10) & 1);
                      auVar123._40_4_ =
                           (uint)bVar57 * auVar111._40_4_ | (uint)!bVar57 * auVar124._40_4_;
                      bVar57 = (bool)((byte)(uVar54 >> 0xb) & 1);
                      auVar123._44_4_ =
                           (uint)bVar57 * auVar111._44_4_ | (uint)!bVar57 * auVar124._44_4_;
                      bVar57 = (bool)((byte)(uVar54 >> 0xc) & 1);
                      auVar123._48_4_ =
                           (uint)bVar57 * auVar111._48_4_ | (uint)!bVar57 * auVar124._48_4_;
                      bVar57 = (bool)((byte)(uVar54 >> 0xd) & 1);
                      auVar123._52_4_ =
                           (uint)bVar57 * auVar111._52_4_ | (uint)!bVar57 * auVar124._52_4_;
                      bVar57 = (bool)((byte)(uVar54 >> 0xe) & 1);
                      auVar123._56_4_ =
                           (uint)bVar57 * auVar111._56_4_ | (uint)!bVar57 * auVar124._56_4_;
                      bVar57 = SUB81(uVar54 >> 0xf,0);
                      auVar123._60_4_ =
                           (uint)bVar57 * auVar111._60_4_ | (uint)!bVar57 * auVar124._60_4_;
                      auVar111 = vmovdqa32_avx512f(auVar111);
                      *(undefined1 (*) [64])(local_620.ray + 0x500) = auVar111;
                      goto LAB_01819c23;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x200) = fVar248;
                }
              }
            }
          }
        }
      }
      goto LAB_01819c23;
    }
    auVar87 = vinsertps_avx(auVar77,auVar78,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }